

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int *piVar23;
  void *pvVar24;
  int iVar25;
  void *pvVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float *pfVar31;
  uint _w;
  float *pfVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  float *pfVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  float *pfVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [64];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [32];
  float fVar193;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 in_ZMM3 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar211 [16];
  float fVar210;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar253;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 in_ZMM7 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [32];
  float fVar301;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  ulong local_120;
  ulong local_110;
  Mat local_b8;
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  undefined1 auVar175 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [32];
  undefined1 auVar183 [32];
  undefined1 auVar240 [32];
  undefined1 auVar245 [32];
  undefined1 auVar250 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  
  uVar37 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar30 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elempack = 0;
  local_b8.h = 0;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.d = (int)local_b8.refcount;
  local_b8.c = local_b8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var4),bottom_blob,
             &local_b8,opt);
  iVar25 = local_b8.h;
  iVar39 = -100;
  if (((Allocator *)local_b8.data != (Allocator *)0x0) && ((long)local_b8.c * local_b8.cstep != 0))
  {
    uVar27 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    lVar40 = 1;
    if (opt->use_packing_layout == true) {
      lVar40 = 8;
      if ((uVar27 & 7) != 0) {
        lVar40 = (ulong)((uVar27 & 3) == 0) * 3 + 1;
      }
    }
    uVar41 = (ulong)(uint)local_b8.h;
    iVar29 = (int)lVar40;
    iVar3 = (local_b8.w + ~((iVar3 + -1) * iVar30)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    _w = iVar3 + 1;
    uVar27 = (int)uVar27 / iVar29;
    Mat::create(top_blob,_w,uVar27,lVar40 * (uVar37 / (ulong)(long)iVar2),iVar29,opt->blob_allocator
               );
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar44 = iVar29 == 8;
      bVar46 = 0 < (int)uVar27;
      if (iVar2 == 8 && (bVar46 && bVar44)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_120 = 0;
        auVar267 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar209._8_4_ = 0x3f000000;
        auVar209._0_8_ = 0x3f0000003f000000;
        auVar209._12_4_ = 0x3f000000;
        auVar209._16_4_ = 0x3f000000;
        auVar209._20_4_ = 0x3f000000;
        auVar209._24_4_ = 0x3f000000;
        auVar209._28_4_ = 0x3f000000;
        auVar89 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_120 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar277 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar277 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_120 * 0x20));
              }
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_120 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4 +
                                   4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-7];
                      fVar63 = pfVar31[-6];
                      fVar90 = pfVar31[-5];
                      fVar91 = pfVar31[-4];
                      fVar193 = pfVar31[-3];
                      fVar92 = pfVar31[-2];
                      fVar190 = pfVar31[-1];
                      fVar192 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar92 * pfVar43[0x2e],
                                                                    CONCAT420(fVar92 * pfVar43[0x2d]
                                                                              ,CONCAT416(fVar92 * 
                                                  pfVar43[0x2c],
                                                  CONCAT412(fVar92 * pfVar43[0x2b],
                                                            CONCAT48(fVar92 * pfVar43[0x2a],
                                                                     CONCAT44(fVar92 * pfVar43[0x29]
                                                                              ,fVar92 * pfVar43[0x28
                                                  ]))))))));
                      fVar191 = fVar63 + fVar90 + fVar90 + fVar91;
                      fVar138 = fVar190 * pfVar43[0x30] + fVar192 * pfVar43[0x38];
                      fVar185 = fVar190 * pfVar43[0x31] + fVar192 * pfVar43[0x39];
                      fVar186 = fVar190 * pfVar43[0x32] + fVar192 * pfVar43[0x3a];
                      fVar187 = fVar190 * pfVar43[0x33] + fVar192 * pfVar43[0x3b];
                      fVar188 = fVar190 * pfVar43[0x34] + fVar192 * pfVar43[0x3c];
                      fVar189 = fVar190 * pfVar43[0x35] + fVar192 * pfVar43[0x3d];
                      fVar190 = fVar190 * pfVar43[0x36] + fVar192 * pfVar43[0x3e];
                      fVar192 = fVar90 + fVar191;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar190,CONCAT420(fVar189,
                                                  CONCAT416(fVar188,CONCAT412(fVar187,CONCAT48(
                                                  fVar186,CONCAT44(fVar185,fVar138))))))));
                      auVar277 = ZEXT3264(CONCAT428(auVar277._28_4_ + fVar49 + fVar63 + fVar90 +
                                                    fVar191 + fVar192,
                                                    CONCAT424(auVar277._24_4_ + fVar49 * pfVar43[6]
                                                              + fVar63 * pfVar43[0xe] +
                                                                fVar90 * pfVar43[0x16] +
                                                              fVar91 * pfVar43[0x1e] +
                                                              fVar193 * pfVar43[0x26] +
                                                              fVar92 * pfVar43[0x2e] + fVar190,
                                                              CONCAT420(auVar277._20_4_ +
                                                                        fVar49 * pfVar43[5] +
                                                                        fVar63 * pfVar43[0xd] +
                                                                        fVar90 * pfVar43[0x15] +
                                                                        fVar91 * pfVar43[0x1d] +
                                                                        fVar193 * pfVar43[0x25] +
                                                                        fVar92 * pfVar43[0x2d] +
                                                                        fVar189,CONCAT416(auVar277.
                                                  _16_4_ + fVar49 * pfVar43[4] +
                                                  fVar63 * pfVar43[0xc] + fVar90 * pfVar43[0x14] +
                                                  fVar91 * pfVar43[0x1c] + fVar193 * pfVar43[0x24] +
                                                  fVar92 * pfVar43[0x2c] + fVar188,
                                                  CONCAT412(auVar277._12_4_ + fVar49 * pfVar43[3] +
                                                            fVar63 * pfVar43[0xb] +
                                                            fVar90 * pfVar43[0x13] +
                                                            fVar91 * pfVar43[0x1b] +
                                                            fVar193 * pfVar43[0x23] +
                                                            fVar92 * pfVar43[0x2b] + fVar187,
                                                            CONCAT48(auVar277._8_4_ +
                                                                     fVar49 * pfVar43[2] +
                                                                     fVar63 * pfVar43[10] +
                                                                     fVar90 * pfVar43[0x12] +
                                                                     fVar91 * pfVar43[0x1a] +
                                                                     fVar193 * pfVar43[0x22] +
                                                                     fVar92 * pfVar43[0x2a] +
                                                                     fVar186,CONCAT44(auVar277._4_4_
                                                                                      + fVar49 * 
                                                  pfVar43[1] +
                                                  fVar63 * pfVar43[9] + fVar90 * pfVar43[0x11] +
                                                  fVar91 * pfVar43[0x19] + fVar193 * pfVar43[0x21] +
                                                  fVar92 * pfVar43[0x29] + fVar185,
                                                  auVar277._0_4_ + fVar49 * *pfVar43 +
                                                  fVar63 * pfVar43[8] + fVar90 * pfVar43[0x10] +
                                                  fVar91 * pfVar43[0x18] + fVar193 * pfVar43[0x20] +
                                                  fVar92 * pfVar43[0x28] + fVar138))))))));
                      pfVar43 = pfVar43 + 0x40;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar272 = auVar277._0_32_;
              auVar56 = auVar267._0_32_;
              fVar138 = auVar277._8_4_;
              fVar185 = auVar277._12_4_;
              fVar186 = auVar277._16_4_;
              fVar187 = auVar277._20_4_;
              fVar188 = auVar277._24_4_;
              auVar82 = auVar89._0_32_;
              fVar49 = auVar89._0_4_;
              fVar63 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar193 = auVar89._16_4_;
              fVar92 = auVar89._20_4_;
              fVar190 = auVar89._24_4_;
              fVar192 = auVar89._28_4_;
              auVar278._28_36_ = auVar277._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar272 = vmaxps_avx(auVar272,auVar56);
                break;
              case 2:
                auVar82 = vmaxps_avx(auVar272,auVar56);
                in_ZMM7 = ZEXT3264(auVar82);
                auVar56 = vminps_avx(auVar272,auVar56);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar272._0_4_ = fVar49 * auVar56._0_4_ + auVar82._0_4_;
                auVar272._4_4_ = fVar49 * auVar56._4_4_ + auVar82._4_4_;
                auVar272._8_4_ = fVar49 * auVar56._8_4_ + auVar82._8_4_;
                auVar272._12_4_ = fVar49 * auVar56._12_4_ + auVar82._12_4_;
                auVar272._16_4_ = fVar49 * auVar56._16_4_ + auVar82._16_4_;
                auVar272._20_4_ = fVar49 * auVar56._20_4_ + auVar82._20_4_;
                auVar272._24_4_ = fVar49 * auVar56._24_4_ + auVar82._24_4_;
                auVar272._28_4_ = auVar56._28_4_ + auVar82._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar238._4_4_ = uVar1;
                auVar238._0_4_ = uVar1;
                auVar238._8_4_ = uVar1;
                auVar238._12_4_ = uVar1;
                auVar238._16_4_ = uVar1;
                auVar238._20_4_ = uVar1;
                auVar238._24_4_ = uVar1;
                auVar238._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar293._4_4_ = uVar1;
                auVar293._0_4_ = uVar1;
                auVar293._8_4_ = uVar1;
                auVar293._12_4_ = uVar1;
                auVar293._16_4_ = uVar1;
                auVar293._20_4_ = uVar1;
                auVar293._24_4_ = uVar1;
                auVar293._28_4_ = uVar1;
                auVar272 = vmaxps_avx(auVar272,auVar238);
                in_ZMM7 = ZEXT3264(auVar272);
                auVar272 = vminps_avx(auVar293,auVar272);
                break;
              case 4:
                auVar239._0_8_ = auVar277._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = -fVar138;
                auVar239._12_4_ = -fVar185;
                auVar239._16_4_ = -fVar186;
                auVar239._20_4_ = -fVar187;
                auVar239._24_4_ = -fVar188;
                auVar239._28_4_ = -auVar277._28_4_;
                auVar126._8_4_ = 0x42b0c0a5;
                auVar126._0_8_ = 0x42b0c0a542b0c0a5;
                auVar126._12_4_ = 0x42b0c0a5;
                auVar126._16_4_ = 0x42b0c0a5;
                auVar126._20_4_ = 0x42b0c0a5;
                auVar126._24_4_ = 0x42b0c0a5;
                auVar126._28_4_ = 0x42b0c0a5;
                auVar272 = vminps_avx(auVar239,auVar126);
                auVar127._8_4_ = 0xc2b0c0a5;
                auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar127._12_4_ = 0xc2b0c0a5;
                auVar127._16_4_ = 0xc2b0c0a5;
                auVar127._20_4_ = 0xc2b0c0a5;
                auVar127._24_4_ = 0xc2b0c0a5;
                auVar127._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar272,auVar127);
                auVar271._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar271._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar271._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar271._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar271._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar271._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar271._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar271._28_4_ = auVar277._28_4_ + 0.5;
                auVar129 = vroundps_avx(auVar271,1);
                auVar272 = vcmpps_avx(auVar271,auVar129,1);
                auVar272 = vandps_avx(auVar272,auVar82);
                auVar272 = vsubps_avx(auVar129,auVar272);
                fVar138 = auVar272._0_4_ * -0.6931472 + auVar56._0_4_;
                fVar185 = auVar272._4_4_ * -0.6931472 + auVar56._4_4_;
                fVar186 = auVar272._8_4_ * -0.6931472 + auVar56._8_4_;
                fVar187 = auVar272._12_4_ * -0.6931472 + auVar56._12_4_;
                fVar188 = auVar272._16_4_ * -0.6931472 + auVar56._16_4_;
                fVar189 = auVar272._20_4_ * -0.6931472 + auVar56._20_4_;
                fVar191 = auVar272._24_4_ * -0.6931472 + auVar56._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar212._0_4_ = (int)auVar272._0_4_;
                auVar212._4_4_ = (int)auVar272._4_4_;
                auVar212._8_4_ = (int)auVar272._8_4_;
                auVar212._12_4_ = (int)auVar272._12_4_;
                auVar240._16_4_ = (int)auVar272._16_4_;
                auVar240._0_16_ = auVar212;
                auVar240._20_4_ = (int)auVar272._20_4_;
                auVar240._24_4_ = (int)auVar272._24_4_;
                auVar240._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar212,0x17);
                auVar139 = vpslld_avx(auVar240._16_16_,0x17);
                auVar50._8_4_ = 0x3f800000;
                auVar50._0_8_ = 0x3f8000003f800000;
                auVar50._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar50);
                auVar211 = vpaddd_avx(auVar211,auVar50);
                auVar128._0_4_ =
                     (fVar138 + fVar49 +
                     fVar138 * fVar138 *
                     (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138
                       + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar211._0_4_ +
                     fVar49;
                auVar128._4_4_ =
                     (fVar185 + fVar63 +
                     fVar185 * fVar185 *
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + 0.5)) * auVar211._4_4_ +
                     fVar63;
                auVar128._8_4_ =
                     (fVar186 + fVar90 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + 0.5)) * auVar211._8_4_ +
                     fVar90;
                auVar128._12_4_ =
                     (fVar187 + fVar91 +
                     fVar187 * fVar187 *
                     (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) * fVar187
                       + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5)) * auVar211._12_4_ +
                     fVar91;
                auVar128._16_4_ =
                     (fVar188 + fVar193 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + 0.5)) * auVar139._0_4_ +
                     fVar193;
                auVar128._20_4_ =
                     (fVar189 + fVar92 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + 0.5)) * auVar139._4_4_ +
                     fVar92;
                auVar128._24_4_ =
                     (fVar191 + fVar190 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + 0.5)) * auVar139._8_4_ +
                     fVar190;
                auVar128._28_4_ = auVar129._28_4_ + auVar56._28_4_ + fVar192 + 0.71826285 + fVar192;
                auVar56 = vrcpps_avx(auVar128);
                in_ZMM7 = ZEXT3264(auVar56);
                fVar49 = auVar56._0_4_;
                fVar63 = auVar56._4_4_;
                auVar12._4_4_ = auVar128._4_4_ * fVar63;
                auVar12._0_4_ = auVar128._0_4_ * fVar49;
                fVar90 = auVar56._8_4_;
                auVar12._8_4_ = auVar128._8_4_ * fVar90;
                fVar91 = auVar56._12_4_;
                auVar12._12_4_ = auVar128._12_4_ * fVar91;
                fVar193 = auVar56._16_4_;
                auVar12._16_4_ = auVar128._16_4_ * fVar193;
                fVar92 = auVar56._20_4_;
                auVar12._20_4_ = auVar128._20_4_ * fVar92;
                fVar190 = auVar56._24_4_;
                auVar12._24_4_ = auVar128._24_4_ * fVar190;
                auVar12._28_4_ = auVar128._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar12);
                auVar272._0_4_ = fVar49 + fVar49 * auVar82._0_4_;
                auVar272._4_4_ = fVar63 + fVar63 * auVar82._4_4_;
                auVar272._8_4_ = fVar90 + fVar90 * auVar82._8_4_;
                auVar272._12_4_ = fVar91 + fVar91 * auVar82._12_4_;
                auVar272._16_4_ = fVar193 + fVar193 * auVar82._16_4_;
                auVar272._20_4_ = fVar92 + fVar92 * auVar82._20_4_;
                auVar272._24_4_ = fVar190 + fVar190 * auVar82._24_4_;
                auVar272._28_4_ = auVar56._28_4_ + auVar82._28_4_;
                break;
              case 5:
                auVar261._8_4_ = 0x42b0c0a5;
                auVar261._0_8_ = 0x42b0c0a542b0c0a5;
                auVar261._12_4_ = 0x42b0c0a5;
                auVar261._16_4_ = 0x42b0c0a5;
                auVar261._20_4_ = 0x42b0c0a5;
                auVar261._24_4_ = 0x42b0c0a5;
                auVar261._28_4_ = 0x42b0c0a5;
                auVar272 = vminps_avx(auVar272,auVar261);
                auVar264._8_4_ = 0xc2b0c0a5;
                auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar264._12_4_ = 0xc2b0c0a5;
                auVar264._16_4_ = 0xc2b0c0a5;
                auVar264._20_4_ = 0xc2b0c0a5;
                auVar264._24_4_ = 0xc2b0c0a5;
                auVar264._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar264,auVar272);
                auVar236._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar236._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar236._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar236._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar236._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar236._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar236._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar236._28_4_ = in_ZMM7._28_4_ + 0.5;
                auVar129 = vroundps_avx(auVar236,1);
                auVar272 = vcmpps_avx(auVar236,auVar129,1);
                auVar272 = vandps_avx(auVar272,auVar82);
                auVar272 = vsubps_avx(auVar129,auVar272);
                auVar9._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar9._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar9._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar9._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar9._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar9._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar9._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar9._28_4_ = auVar129._28_4_;
                auVar56 = vsubps_avx(auVar56,auVar9);
                fVar189 = auVar56._0_4_;
                fVar191 = auVar56._4_4_;
                fVar296 = auVar56._8_4_;
                fVar297 = auVar56._12_4_;
                fVar298 = auVar56._16_4_;
                fVar299 = auVar56._20_4_;
                fVar300 = auVar56._24_4_;
                auVar139._0_4_ = (int)auVar272._0_4_;
                auVar139._4_4_ = (int)auVar272._4_4_;
                auVar139._8_4_ = (int)auVar272._8_4_;
                auVar139._12_4_ = (int)auVar272._12_4_;
                auVar168._16_4_ = (int)auVar272._16_4_;
                auVar168._0_16_ = auVar139;
                auVar168._20_4_ = (int)auVar272._20_4_;
                auVar168._24_4_ = (int)auVar272._24_4_;
                auVar168._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar139,0x17);
                auVar139 = vpslld_avx(auVar168._16_16_,0x17);
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = 0x3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar202);
                auVar211 = vpaddd_avx(auVar211,auVar202);
                auVar237._0_4_ =
                     (fVar189 + fVar49 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + 0.5)) * auVar211._0_4_ +
                     fVar49;
                auVar237._4_4_ =
                     (fVar191 + fVar63 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + 0.5)) * auVar211._4_4_ +
                     fVar63;
                auVar237._8_4_ =
                     (fVar296 + fVar90 +
                     fVar296 * fVar296 *
                     (((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) * fVar296
                       + 0.041665796) * fVar296 + 0.16666666) * fVar296 + 0.5)) * auVar211._8_4_ +
                     fVar90;
                auVar237._12_4_ =
                     (fVar297 + fVar91 +
                     fVar297 * fVar297 *
                     (((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                       + 0.041665796) * fVar297 + 0.16666666) * fVar297 + 0.5)) * auVar211._12_4_ +
                     fVar91;
                auVar237._16_4_ =
                     (fVar298 + fVar193 +
                     fVar298 * fVar298 *
                     (((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) * fVar298
                       + 0.041665796) * fVar298 + 0.16666666) * fVar298 + 0.5)) * auVar139._0_4_ +
                     fVar193;
                auVar237._20_4_ =
                     (fVar299 + fVar92 +
                     fVar299 * fVar299 *
                     (((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) * fVar299
                       + 0.041665796) * fVar299 + 0.16666666) * fVar299 + 0.5)) * auVar139._4_4_ +
                     fVar92;
                auVar237._24_4_ =
                     (fVar300 + fVar190 +
                     fVar300 * fVar300 *
                     (((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                       + 0.041665796) * fVar300 + 0.16666666) * fVar300 + 0.5)) * auVar139._8_4_ +
                     fVar190;
                auVar237._28_4_ =
                     auVar56._28_4_ + fVar192 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
                     fVar192;
                auVar123._8_4_ = 0x800000;
                auVar123._0_8_ = 0x80000000800000;
                auVar123._12_4_ = 0x800000;
                auVar123._16_4_ = 0x800000;
                auVar123._20_4_ = 0x800000;
                auVar123._24_4_ = 0x800000;
                auVar123._28_4_ = 0x800000;
                auVar129 = vmaxps_avx(auVar237,auVar123);
                auVar139 = vpsrld_avx(auVar129._16_16_,0x17);
                auVar200._8_4_ = 0x807fffff;
                auVar200._0_8_ = 0x807fffff807fffff;
                auVar200._12_4_ = 0x807fffff;
                auVar200._16_4_ = 0x807fffff;
                auVar200._20_4_ = 0x807fffff;
                auVar200._24_4_ = 0x807fffff;
                auVar200._28_4_ = 0x807fffff;
                auVar272 = vandps_avx(auVar129,auVar200);
                auVar174 = vorps_avx(auVar272,auVar209);
                auVar201._8_4_ = 0x3f3504f3;
                auVar201._0_8_ = 0x3f3504f33f3504f3;
                auVar201._12_4_ = 0x3f3504f3;
                auVar201._16_4_ = 0x3f3504f3;
                auVar201._20_4_ = 0x3f3504f3;
                auVar201._24_4_ = 0x3f3504f3;
                auVar201._28_4_ = 0x3f3504f3;
                auVar56 = vcmpps_avx(auVar201,auVar174,2);
                auVar272 = vandnps_avx(auVar56,auVar174);
                fVar189 = auVar174._0_4_ + -1.0 + auVar272._0_4_;
                fVar191 = auVar174._4_4_ + -1.0 + auVar272._4_4_;
                fVar296 = auVar174._8_4_ + -1.0 + auVar272._8_4_;
                fVar297 = auVar174._12_4_ + -1.0 + auVar272._12_4_;
                fVar298 = auVar174._16_4_ + -1.0 + auVar272._16_4_;
                fVar299 = auVar174._20_4_ + -1.0 + auVar272._20_4_;
                fVar300 = auVar174._24_4_ + -1.0 + auVar272._24_4_;
                auVar139 = vpsubd_avx(auVar139,auVar56._16_16_);
                auVar211 = vpsrld_avx(auVar129._0_16_,0x17);
                auVar257._8_4_ = 0xffffff81;
                auVar257._0_8_ = 0xffffff81ffffff81;
                auVar257._12_4_ = 0xffffff81;
                auVar139 = vpaddd_avx(auVar257,auVar139);
                auVar211 = vpsubd_avx(auVar211,auVar56._0_16_);
                auVar211 = vpaddd_avx(auVar257,auVar211);
                auVar124._16_16_ = auVar139;
                auVar124._0_16_ = auVar211;
                auVar56 = vcmpps_avx(auVar237,_DAT_00315400,2);
                auVar129 = vcvtdq2ps_avx(auVar124);
                auVar10._4_4_ =
                     (fVar191 + auVar129._4_4_ * 0.6931472 +
                     fVar191 * fVar191 *
                     (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (
                                                  fVar191 * (fVar191 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._0_4_ =
                     (fVar189 + auVar129._0_4_ * 0.6931472 +
                     fVar189 * fVar189 *
                     (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (
                                                  fVar189 * (fVar189 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._8_4_ =
                     (fVar296 + auVar129._8_4_ * 0.6931472 +
                     fVar296 * fVar296 *
                     (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (
                                                  fVar296 * (fVar296 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._12_4_ =
                     (fVar297 + auVar129._12_4_ * 0.6931472 +
                     fVar297 * fVar297 *
                     (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (
                                                  fVar297 * (fVar297 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._16_4_ =
                     (fVar298 + auVar129._16_4_ * 0.6931472 +
                     fVar298 * fVar298 *
                     (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (
                                                  fVar298 * (fVar298 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._20_4_ =
                     (fVar299 + auVar129._20_4_ * 0.6931472 +
                     fVar299 * fVar299 *
                     (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (
                                                  fVar299 * (fVar299 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._24_4_ =
                     (fVar300 + auVar129._24_4_ * 0.6931472 +
                     fVar300 * fVar300 *
                     (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (
                                                  fVar300 * (fVar300 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._28_4_ = auVar174._28_4_ + -1.0 + auVar272._28_4_ + auVar129._28_4_ + 0.0;
                auVar169._8_4_ = 0x7fffffff;
                auVar169._0_8_ = 0x7fffffff7fffffff;
                auVar169._12_4_ = 0x7fffffff;
                auVar169._16_4_ = 0x7fffffff;
                auVar169._20_4_ = 0x7fffffff;
                auVar169._24_4_ = 0x7fffffff;
                auVar169._28_4_ = 0x7fffffff;
                auVar272 = vblendvps_avx(auVar10,auVar169,auVar56);
                auVar170._8_4_ = 0x42b0c0a5;
                auVar170._0_8_ = 0x42b0c0a542b0c0a5;
                auVar170._12_4_ = 0x42b0c0a5;
                auVar170._16_4_ = 0x42b0c0a5;
                auVar170._20_4_ = 0x42b0c0a5;
                auVar170._24_4_ = 0x42b0c0a5;
                auVar170._28_4_ = 0x42b0c0a5;
                auVar272 = vminps_avx(auVar272,auVar170);
                auVar171._8_4_ = 0xc2b0c0a5;
                auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar171._12_4_ = 0xc2b0c0a5;
                auVar171._16_4_ = 0xc2b0c0a5;
                auVar171._20_4_ = 0xc2b0c0a5;
                auVar171._24_4_ = 0xc2b0c0a5;
                auVar171._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar272,auVar171);
                auVar267 = ZEXT864(0) << 0x20;
                auVar172._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar172._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar172._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar172._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar172._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar172._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar172._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar172._28_4_ = 0xc2afc0a5;
                auVar129 = vroundps_avx(auVar172,1);
                auVar272 = vcmpps_avx(auVar172,auVar129,1);
                auVar272 = vandps_avx(auVar272,auVar82);
                auVar272 = vsubps_avx(auVar129,auVar272);
                auVar11._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar11._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar11._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar11._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar11._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar11._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar11._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar11._28_4_ = auVar129._28_4_;
                auVar56 = vsubps_avx(auVar56,auVar11);
                fVar189 = auVar56._0_4_;
                fVar191 = auVar56._4_4_;
                fVar296 = auVar56._8_4_;
                fVar297 = auVar56._12_4_;
                fVar298 = auVar56._16_4_;
                fVar299 = auVar56._20_4_;
                fVar300 = auVar56._24_4_;
                auVar89 = ZEXT3264(auVar82);
                fVar210 = ((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) *
                            fVar189 + 0.041665796) * fVar189 + 0.16666666) * fVar189 + 0.5;
                fVar251 = ((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) *
                            fVar191 + 0.041665796) * fVar191 + 0.16666666) * fVar191 + 0.5;
                fVar252 = ((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) *
                            fVar296 + 0.041665796) * fVar296 + 0.16666666) * fVar296 + 0.5;
                fVar253 = ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) *
                            fVar297 + 0.041665796) * fVar297 + 0.16666666) * fVar297 + 0.5;
                fVar254 = ((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) *
                            fVar298 + 0.041665796) * fVar298 + 0.16666666) * fVar298 + 0.5;
                fVar255 = ((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) *
                            fVar299 + 0.041665796) * fVar299 + 0.16666666) * fVar299 + 0.5;
                fVar256 = ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) *
                            fVar300 + 0.041665796) * fVar300 + 0.16666666) * fVar300 + 0.5;
                in_ZMM7 = ZEXT3264(CONCAT428(auVar237._28_4_ + 0.0013981999 + 0.008333452 +
                                             0.041665796 + 0.16666666 + 0.5,
                                             CONCAT424(fVar256,CONCAT420(fVar255,CONCAT416(fVar254,
                                                  CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(
                                                  fVar251,fVar210))))))));
                auVar211._0_4_ = (int)auVar272._0_4_;
                auVar211._4_4_ = (int)auVar272._4_4_;
                auVar211._8_4_ = (int)auVar272._8_4_;
                auVar211._12_4_ = (int)auVar272._12_4_;
                auVar173._16_4_ = (int)auVar272._16_4_;
                auVar173._0_16_ = auVar211;
                auVar173._20_4_ = (int)auVar272._20_4_;
                auVar173._24_4_ = (int)auVar272._24_4_;
                auVar173._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar211,0x17);
                auVar139 = vpslld_avx(auVar173._16_16_,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar202);
                auVar211 = vpaddd_avx(auVar211,auVar202);
                auVar125._0_4_ =
                     (fVar189 + fVar49 + fVar189 * fVar189 * fVar210) * auVar211._0_4_ + fVar49;
                auVar125._4_4_ =
                     (fVar191 + fVar63 + fVar191 * fVar191 * fVar251) * auVar211._4_4_ + fVar63;
                auVar125._8_4_ =
                     (fVar296 + fVar90 + fVar296 * fVar296 * fVar252) * auVar211._8_4_ + fVar90;
                auVar125._12_4_ =
                     (fVar297 + fVar91 + fVar297 * fVar297 * fVar253) * auVar211._12_4_ + fVar91;
                auVar125._16_4_ =
                     (fVar298 + fVar193 + fVar298 * fVar298 * fVar254) * auVar139._0_4_ + fVar193;
                auVar125._20_4_ =
                     (fVar299 + fVar92 + fVar299 * fVar299 * fVar255) * auVar139._4_4_ + fVar92;
                auVar125._24_4_ =
                     (fVar300 + fVar190 + fVar300 * fVar300 * fVar256) * auVar139._8_4_ + fVar190;
                auVar125._28_4_ = auVar56._28_4_ + fVar192 + auVar129._28_4_ + fVar192;
                auVar272 = vrcpps_avx(auVar125);
                fVar49 = auVar272._0_4_;
                fVar63 = auVar272._4_4_;
                fVar90 = auVar272._8_4_;
                fVar91 = auVar272._12_4_;
                fVar193 = auVar272._16_4_;
                fVar92 = auVar272._20_4_;
                fVar190 = auVar272._24_4_;
                auVar82._4_4_ = auVar125._4_4_ * (fVar63 + fVar63);
                auVar82._0_4_ = auVar125._0_4_ * (fVar49 + fVar49);
                auVar82._8_4_ = auVar125._8_4_ * (fVar90 + fVar90);
                auVar82._12_4_ = auVar125._12_4_ * (fVar91 + fVar91);
                auVar82._16_4_ = auVar125._16_4_ * (fVar193 + fVar193);
                auVar82._20_4_ = auVar125._20_4_ * (fVar92 + fVar92);
                auVar82._24_4_ = auVar125._24_4_ * (fVar190 + fVar190);
                auVar82._28_4_ = auVar125._28_4_;
                auVar56._8_4_ = 0x40000000;
                auVar56._0_8_ = 0x4000000040000000;
                auVar56._12_4_ = 0x40000000;
                auVar56._16_4_ = 0x40000000;
                auVar56._20_4_ = 0x40000000;
                auVar56._24_4_ = 0x40000000;
                auVar56._28_4_ = 0x40000000;
                auVar82 = vsubps_avx(auVar56,auVar82);
                auVar174._0_4_ = fVar49 + fVar49 + -1.0;
                auVar174._4_4_ = fVar63 + fVar63 + -1.0;
                auVar174._8_4_ = fVar90 + fVar90 + -1.0;
                auVar174._12_4_ = fVar91 + fVar91 + -1.0;
                auVar174._16_4_ = fVar193 + fVar193 + -1.0;
                auVar174._20_4_ = fVar92 + fVar92 + -1.0;
                auVar174._24_4_ = fVar190 + fVar190 + -1.0;
                auVar174._28_4_ = auVar272._28_4_ + auVar272._28_4_ + -1.0;
                auVar120._0_4_ = auVar174._0_4_ + fVar49 * auVar82._0_4_;
                auVar120._4_4_ = auVar174._4_4_ + fVar63 * auVar82._4_4_;
                auVar120._8_4_ = auVar174._8_4_ + fVar90 * auVar82._8_4_;
                auVar120._12_4_ = auVar174._12_4_ + fVar91 * auVar82._12_4_;
                auVar120._16_4_ = auVar174._16_4_ + fVar193 * auVar82._16_4_;
                auVar120._20_4_ = auVar174._20_4_ + fVar92 * auVar82._20_4_;
                auVar120._24_4_ = auVar174._24_4_ + fVar190 * auVar82._24_4_;
                goto LAB_00308c5f;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar174._4_4_ = fVar63;
                auVar174._0_4_ = fVar63;
                auVar174._8_4_ = fVar63;
                auVar174._12_4_ = fVar63;
                auVar174._16_4_ = fVar63;
                auVar174._20_4_ = fVar63;
                auVar174._24_4_ = fVar63;
                auVar174._28_4_ = fVar63;
                auVar129._0_4_ = auVar277._0_4_ * fVar49 + fVar63;
                auVar129._4_4_ = auVar277._4_4_ * fVar49 + fVar63;
                auVar129._8_4_ = fVar138 * fVar49 + fVar63;
                auVar129._12_4_ = fVar185 * fVar49 + fVar63;
                auVar129._16_4_ = fVar186 * fVar49 + fVar63;
                auVar129._20_4_ = fVar187 * fVar49 + fVar63;
                auVar129._24_4_ = fVar188 * fVar49 + fVar63;
                auVar129._28_4_ = fVar49 + fVar63;
                auVar272 = vmaxps_avx(auVar56,auVar129);
                auVar272 = vminps_avx(auVar272,auVar82);
                auVar120 = auVar272._0_28_;
LAB_00308c5f:
                in_ZMM3 = ZEXT3264(auVar174);
                auVar278._0_4_ = auVar277._0_4_ * auVar120._0_4_;
                auVar278._4_4_ = auVar277._4_4_ * auVar120._4_4_;
                auVar278._8_4_ = fVar138 * auVar120._8_4_;
                auVar278._12_4_ = fVar185 * auVar120._12_4_;
                auVar278._16_4_ = fVar186 * auVar120._16_4_;
                auVar278._20_4_ = fVar187 * auVar120._20_4_;
                auVar278._24_4_ = fVar188 * auVar120._24_4_;
                auVar272 = auVar278._0_32_;
              }
              *pauVar34 = auVar272;
              pauVar34 = pauVar34 + 1;
              iVar39 = iVar39 + 8;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          local_120 = local_120 + 1;
        } while (local_120 != uVar27);
      }
      if (iVar2 == 1 && (bVar46 && bVar44)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar277 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar267 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar262._8_4_ = 0x42b0c0a5;
        auVar262._0_8_ = 0x42b0c0a542b0c0a5;
        auVar262._12_4_ = 0x42b0c0a5;
        auVar262._16_4_ = 0x42b0c0a5;
        auVar262._20_4_ = 0x42b0c0a5;
        auVar262._24_4_ = 0x42b0c0a5;
        auVar262._28_4_ = 0x42b0c0a5;
        auVar265._8_4_ = 0xc2b0c0a5;
        auVar265._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar265._12_4_ = 0xc2b0c0a5;
        auVar265._16_4_ = 0xc2b0c0a5;
        auVar265._20_4_ = 0xc2b0c0a5;
        auVar265._24_4_ = 0xc2b0c0a5;
        auVar265._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar278 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar278 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar37 * 0x20))
                ;
              }
              if (0 < iVar25) {
                pfVar32 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = *pfVar31;
                      auVar278 = ZEXT3264(CONCAT428(auVar278._28_4_ + fVar49,
                                                    CONCAT424(auVar278._24_4_ + fVar49 * pfVar32[6],
                                                              CONCAT420(auVar278._20_4_ +
                                                                        fVar49 * pfVar32[5],
                                                                        CONCAT416(auVar278._16_4_ +
                                                                                  fVar49 * pfVar32[4
                                                  ],CONCAT412(auVar278._12_4_ + fVar49 * pfVar32[3],
                                                              CONCAT48(auVar278._8_4_ +
                                                                       fVar49 * pfVar32[2],
                                                                       CONCAT44(auVar278._4_4_ +
                                                                                fVar49 * pfVar32[1],
                                                                                auVar278._0_4_ +
                                                                                fVar49 * *pfVar32)))
                                                  )))));
                      pfVar32 = pfVar32 + 8;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar36 != uVar41);
              }
              auVar274 = auVar278._0_32_;
              fVar297 = auVar278._8_4_;
              fVar298 = auVar278._12_4_;
              fVar299 = auVar278._16_4_;
              fVar300 = auVar278._20_4_;
              fVar210 = auVar278._24_4_;
              fVar138 = auVar277._0_4_;
              fVar185 = auVar277._4_4_;
              fVar186 = auVar277._8_4_;
              fVar187 = auVar277._12_4_;
              fVar188 = auVar277._16_4_;
              fVar189 = auVar277._20_4_;
              fVar191 = auVar277._24_4_;
              fVar296 = auVar277._28_4_;
              auVar209 = auVar267._0_32_;
              fVar49 = auVar267._0_4_;
              fVar63 = auVar267._4_4_;
              fVar90 = auVar267._8_4_;
              fVar91 = auVar267._12_4_;
              fVar193 = auVar267._16_4_;
              fVar92 = auVar267._20_4_;
              fVar190 = auVar267._24_4_;
              fVar192 = auVar267._28_4_;
              auVar279._28_36_ = auVar278._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar274 = vmaxps_avx(auVar274,auVar89._0_32_);
                break;
              case 2:
                auVar209 = vmaxps_avx(auVar274,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar209);
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar272 = vminps_avx(auVar274,ZEXT1632(ZEXT816(0) << 0x40));
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar274._0_4_ = fVar49 * auVar272._0_4_ + auVar209._0_4_;
                auVar274._4_4_ = fVar49 * auVar272._4_4_ + auVar209._4_4_;
                auVar274._8_4_ = fVar49 * auVar272._8_4_ + auVar209._8_4_;
                auVar274._12_4_ = fVar49 * auVar272._12_4_ + auVar209._12_4_;
                auVar274._16_4_ = fVar49 * auVar272._16_4_ + auVar209._16_4_;
                auVar274._20_4_ = fVar49 * auVar272._20_4_ + auVar209._20_4_;
                auVar274._24_4_ = fVar49 * auVar272._24_4_ + auVar209._24_4_;
                auVar274._28_4_ = auVar272._28_4_ + auVar209._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar243._4_4_ = uVar1;
                auVar243._0_4_ = uVar1;
                auVar243._8_4_ = uVar1;
                auVar243._12_4_ = uVar1;
                auVar243._16_4_ = uVar1;
                auVar243._20_4_ = uVar1;
                auVar243._24_4_ = uVar1;
                auVar243._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar294._4_4_ = uVar1;
                auVar294._0_4_ = uVar1;
                auVar294._8_4_ = uVar1;
                auVar294._12_4_ = uVar1;
                auVar294._16_4_ = uVar1;
                auVar294._20_4_ = uVar1;
                auVar294._24_4_ = uVar1;
                auVar294._28_4_ = uVar1;
                auVar209 = vmaxps_avx(auVar274,auVar243);
                in_ZMM7 = ZEXT3264(auVar209);
                auVar274 = vminps_avx(auVar294,auVar209);
                break;
              case 4:
                auVar244._0_8_ = auVar278._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = -fVar297;
                auVar244._12_4_ = -fVar298;
                auVar244._16_4_ = -fVar299;
                auVar244._20_4_ = -fVar300;
                auVar244._24_4_ = -fVar210;
                auVar244._28_4_ = -auVar278._28_4_;
                auVar84._8_4_ = 0x42b0c0a5;
                auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                auVar84._12_4_ = 0x42b0c0a5;
                auVar84._16_4_ = 0x42b0c0a5;
                auVar84._20_4_ = 0x42b0c0a5;
                auVar84._24_4_ = 0x42b0c0a5;
                auVar84._28_4_ = 0x42b0c0a5;
                auVar272 = vminps_avx(auVar244,auVar84);
                auVar85._8_4_ = 0xc2b0c0a5;
                auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar85._12_4_ = 0xc2b0c0a5;
                auVar85._16_4_ = 0xc2b0c0a5;
                auVar85._20_4_ = 0xc2b0c0a5;
                auVar85._24_4_ = 0xc2b0c0a5;
                auVar85._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar272,auVar85);
                auVar273._0_4_ = auVar82._0_4_ * 1.442695 + fVar138;
                auVar273._4_4_ = auVar82._4_4_ * 1.442695 + fVar185;
                auVar273._8_4_ = auVar82._8_4_ * 1.442695 + fVar186;
                auVar273._12_4_ = auVar82._12_4_ * 1.442695 + fVar187;
                auVar273._16_4_ = auVar82._16_4_ * 1.442695 + fVar188;
                auVar273._20_4_ = auVar82._20_4_ * 1.442695 + fVar189;
                auVar273._24_4_ = auVar82._24_4_ * 1.442695 + fVar191;
                auVar273._28_4_ = auVar278._28_4_ + fVar296;
                auVar56 = vroundps_avx(auVar273,1);
                auVar272 = vcmpps_avx(auVar273,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                fVar297 = auVar272._0_4_ * -0.6931472 + auVar82._0_4_;
                fVar298 = auVar272._4_4_ * -0.6931472 + auVar82._4_4_;
                fVar299 = auVar272._8_4_ * -0.6931472 + auVar82._8_4_;
                fVar300 = auVar272._12_4_ * -0.6931472 + auVar82._12_4_;
                fVar210 = auVar272._16_4_ * -0.6931472 + auVar82._16_4_;
                fVar251 = auVar272._20_4_ * -0.6931472 + auVar82._20_4_;
                fVar252 = auVar272._24_4_ * -0.6931472 + auVar82._24_4_;
                auVar213._0_4_ = (int)auVar272._0_4_;
                auVar213._4_4_ = (int)auVar272._4_4_;
                auVar213._8_4_ = (int)auVar272._8_4_;
                auVar213._12_4_ = (int)auVar272._12_4_;
                auVar245._16_4_ = (int)auVar272._16_4_;
                auVar245._0_16_ = auVar213;
                auVar245._20_4_ = (int)auVar272._20_4_;
                auVar245._24_4_ = (int)auVar272._24_4_;
                auVar245._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar213,0x17);
                auVar139 = vpslld_avx(auVar245._16_16_,0x17);
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = 0x3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar65);
                auVar211 = vpaddd_avx(auVar211,auVar65);
                auVar132._0_4_ =
                     (fVar297 + fVar49 +
                     fVar297 * fVar297 *
                     (fVar138 +
                     ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                      + 0.041665796) * fVar297 + 0.16666666) * fVar297)) * auVar211._0_4_ + fVar49;
                auVar132._4_4_ =
                     (fVar298 + fVar63 +
                     fVar298 * fVar298 *
                     (fVar185 +
                     ((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) * fVar298
                      + 0.041665796) * fVar298 + 0.16666666) * fVar298)) * auVar211._4_4_ + fVar63;
                auVar132._8_4_ =
                     (fVar299 + fVar90 +
                     fVar299 * fVar299 *
                     (fVar186 +
                     ((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) * fVar299
                      + 0.041665796) * fVar299 + 0.16666666) * fVar299)) * auVar211._8_4_ + fVar90;
                auVar132._12_4_ =
                     (fVar300 + fVar91 +
                     fVar300 * fVar300 *
                     (fVar187 +
                     ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                      + 0.041665796) * fVar300 + 0.16666666) * fVar300)) * auVar211._12_4_ + fVar91;
                auVar132._16_4_ =
                     (fVar210 + fVar193 +
                     fVar210 * fVar210 *
                     (fVar188 +
                     ((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210
                      + 0.041665796) * fVar210 + 0.16666666) * fVar210)) * auVar139._0_4_ + fVar193;
                auVar132._20_4_ =
                     (fVar251 + fVar92 +
                     fVar251 * fVar251 *
                     (fVar189 +
                     ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                      + 0.041665796) * fVar251 + 0.16666666) * fVar251)) * auVar139._4_4_ + fVar92;
                auVar132._24_4_ =
                     (fVar252 + fVar190 +
                     fVar252 * fVar252 *
                     (fVar191 +
                     ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                      + 0.041665796) * fVar252 + 0.16666666) * fVar252)) * auVar139._8_4_ + fVar190;
                auVar132._28_4_ =
                     auVar56._28_4_ + auVar82._28_4_ + fVar192 + fVar296 + -0.47508308 + fVar192;
                auVar272 = vrcpps_avx(auVar132);
                in_ZMM7 = ZEXT3264(auVar272);
                fVar49 = auVar272._0_4_;
                fVar63 = auVar272._4_4_;
                auVar17._4_4_ = auVar132._4_4_ * fVar63;
                auVar17._0_4_ = auVar132._0_4_ * fVar49;
                fVar90 = auVar272._8_4_;
                auVar17._8_4_ = auVar132._8_4_ * fVar90;
                fVar91 = auVar272._12_4_;
                auVar17._12_4_ = auVar132._12_4_ * fVar91;
                fVar193 = auVar272._16_4_;
                auVar17._16_4_ = auVar132._16_4_ * fVar193;
                fVar92 = auVar272._20_4_;
                auVar17._20_4_ = auVar132._20_4_ * fVar92;
                fVar190 = auVar272._24_4_;
                auVar17._24_4_ = auVar132._24_4_ * fVar190;
                auVar17._28_4_ = auVar132._28_4_;
                auVar209 = vsubps_avx(auVar209,auVar17);
                auVar274._0_4_ = fVar49 + fVar49 * auVar209._0_4_;
                auVar274._4_4_ = fVar63 + fVar63 * auVar209._4_4_;
                auVar274._8_4_ = fVar90 + fVar90 * auVar209._8_4_;
                auVar274._12_4_ = fVar91 + fVar91 * auVar209._12_4_;
                auVar274._16_4_ = fVar193 + fVar193 * auVar209._16_4_;
                auVar274._20_4_ = fVar92 + fVar92 * auVar209._20_4_;
                auVar274._24_4_ = fVar190 + fVar190 * auVar209._24_4_;
                auVar274._28_4_ = auVar272._28_4_ + auVar209._28_4_;
                break;
              case 5:
                auVar272 = vminps_avx(auVar274,auVar262);
                auVar82 = vmaxps_avx(auVar265,auVar272);
                auVar241._0_4_ = fVar138 + auVar82._0_4_ * 1.442695;
                auVar241._4_4_ = fVar185 + auVar82._4_4_ * 1.442695;
                auVar241._8_4_ = fVar186 + auVar82._8_4_ * 1.442695;
                auVar241._12_4_ = fVar187 + auVar82._12_4_ * 1.442695;
                auVar241._16_4_ = fVar188 + auVar82._16_4_ * 1.442695;
                auVar241._20_4_ = fVar189 + auVar82._20_4_ * 1.442695;
                auVar241._24_4_ = fVar191 + auVar82._24_4_ * 1.442695;
                auVar241._28_4_ = fVar296 + in_ZMM7._28_4_;
                auVar56 = vroundps_avx(auVar241,1);
                auVar272 = vcmpps_avx(auVar241,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                auVar13._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar13._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar13._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar13._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar13._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar13._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar13._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar13._28_4_ = auVar56._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar13);
                fVar251 = auVar82._0_4_;
                fVar252 = auVar82._4_4_;
                fVar253 = auVar82._8_4_;
                fVar254 = auVar82._12_4_;
                fVar255 = auVar82._16_4_;
                fVar256 = auVar82._20_4_;
                fVar301 = auVar82._24_4_;
                auVar140._0_4_ = (int)auVar272._0_4_;
                auVar140._4_4_ = (int)auVar272._4_4_;
                auVar140._8_4_ = (int)auVar272._8_4_;
                auVar140._12_4_ = (int)auVar272._12_4_;
                auVar175._16_4_ = (int)auVar272._16_4_;
                auVar175._0_16_ = auVar140;
                auVar175._20_4_ = (int)auVar272._20_4_;
                auVar175._24_4_ = (int)auVar272._24_4_;
                auVar175._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar140,0x17);
                auVar139 = vpslld_avx(auVar175._16_16_,0x17);
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = 0x3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar203);
                auVar211 = vpaddd_avx(auVar211,auVar203);
                auVar242._0_4_ =
                     (fVar251 + fVar49 +
                     fVar251 * fVar251 *
                     (((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                       + 0.041665796) * fVar251 + 0.16666666) * fVar251 + fVar138)) * auVar211._0_4_
                     + fVar49;
                auVar242._4_4_ =
                     (fVar252 + fVar63 +
                     fVar252 * fVar252 *
                     (((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                       + 0.041665796) * fVar252 + 0.16666666) * fVar252 + fVar185)) * auVar211._4_4_
                     + fVar63;
                auVar242._8_4_ =
                     (fVar253 + fVar90 +
                     fVar253 * fVar253 *
                     (((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 + 0.008333452) * fVar253
                       + 0.041665796) * fVar253 + 0.16666666) * fVar253 + fVar186)) * auVar211._8_4_
                     + fVar90;
                auVar242._12_4_ =
                     (fVar254 + fVar91 +
                     fVar254 * fVar254 *
                     (((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                       + 0.041665796) * fVar254 + 0.16666666) * fVar254 + fVar187)) *
                     auVar211._12_4_ + fVar91;
                auVar242._16_4_ =
                     (fVar255 + fVar193 +
                     fVar255 * fVar255 *
                     (((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                       + 0.041665796) * fVar255 + 0.16666666) * fVar255 + fVar188)) * auVar139._0_4_
                     + fVar193;
                auVar242._20_4_ =
                     (fVar256 + fVar92 +
                     fVar256 * fVar256 *
                     (((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 + 0.008333452) * fVar256
                       + 0.041665796) * fVar256 + 0.16666666) * fVar256 + fVar189)) * auVar139._4_4_
                     + fVar92;
                auVar242._24_4_ =
                     (fVar301 + fVar190 +
                     fVar301 * fVar301 *
                     (((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301
                       + 0.041665796) * fVar301 + 0.16666666) * fVar301 + fVar191)) * auVar139._8_4_
                     + fVar190;
                auVar242._28_4_ =
                     auVar82._28_4_ + fVar192 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar296 + fVar192;
                auVar57._8_4_ = 0x800000;
                auVar57._0_8_ = 0x80000000800000;
                auVar57._12_4_ = 0x800000;
                auVar57._16_4_ = 0x800000;
                auVar57._20_4_ = 0x800000;
                auVar57._24_4_ = 0x800000;
                auVar57._28_4_ = 0x800000;
                auVar56 = vmaxps_avx(auVar242,auVar57);
                auVar139 = vpsrld_avx(auVar56._16_16_,0x17);
                auVar58._8_4_ = 0x807fffff;
                auVar58._0_8_ = 0x807fffff807fffff;
                auVar58._12_4_ = 0x807fffff;
                auVar58._16_4_ = 0x807fffff;
                auVar58._20_4_ = 0x807fffff;
                auVar58._24_4_ = 0x807fffff;
                auVar58._28_4_ = 0x807fffff;
                auVar272 = vandps_avx(auVar56,auVar58);
                auVar129 = vorps_avx(auVar272,auVar277._0_32_);
                auVar59._8_4_ = 0x3f3504f3;
                auVar59._0_8_ = 0x3f3504f33f3504f3;
                auVar59._12_4_ = 0x3f3504f3;
                auVar59._16_4_ = 0x3f3504f3;
                auVar59._20_4_ = 0x3f3504f3;
                auVar59._24_4_ = 0x3f3504f3;
                auVar59._28_4_ = 0x3f3504f3;
                auVar82 = vcmpps_avx(auVar59,auVar129,2);
                auVar272 = vandnps_avx(auVar82,auVar129);
                fVar251 = auVar129._0_4_ + -1.0 + auVar272._0_4_;
                fVar252 = auVar129._4_4_ + -1.0 + auVar272._4_4_;
                fVar253 = auVar129._8_4_ + -1.0 + auVar272._8_4_;
                fVar254 = auVar129._12_4_ + -1.0 + auVar272._12_4_;
                fVar255 = auVar129._16_4_ + -1.0 + auVar272._16_4_;
                fVar256 = auVar129._20_4_ + -1.0 + auVar272._20_4_;
                fVar301 = auVar129._24_4_ + -1.0 + auVar272._24_4_;
                auVar139 = vpsubd_avx(auVar139,auVar82._16_16_);
                auVar211 = vpsrld_avx(auVar56._0_16_,0x17);
                auVar51._8_4_ = 0xffffff81;
                auVar51._0_8_ = 0xffffff81ffffff81;
                auVar51._12_4_ = 0xffffff81;
                auVar139 = vpaddd_avx(auVar139,auVar51);
                auVar211 = vpsubd_avx(auVar211,auVar82._0_16_);
                auVar211 = vpaddd_avx(auVar211,auVar51);
                auVar130._16_16_ = auVar139;
                auVar130._0_16_ = auVar211;
                auVar89 = ZEXT864(0) << 0x20;
                auVar82 = vcmpps_avx(auVar242,ZEXT832(0) << 0x20,2);
                auVar56 = vcvtdq2ps_avx(auVar130);
                auVar14._4_4_ =
                     (fVar252 + auVar56._4_4_ * 0.6931472 +
                     fVar252 * fVar252 *
                     (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (
                                                  fVar252 * (fVar252 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._0_4_ =
                     (fVar251 + auVar56._0_4_ * 0.6931472 +
                     fVar251 * fVar251 *
                     (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (
                                                  fVar251 * (fVar251 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._8_4_ =
                     (fVar253 + auVar56._8_4_ * 0.6931472 +
                     fVar253 * fVar253 *
                     (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (
                                                  fVar253 * (fVar253 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._12_4_ =
                     (fVar254 + auVar56._12_4_ * 0.6931472 +
                     fVar254 * fVar254 *
                     (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (
                                                  fVar254 * (fVar254 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._16_4_ =
                     (fVar255 + auVar56._16_4_ * 0.6931472 +
                     fVar255 * fVar255 *
                     (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (
                                                  fVar255 * (fVar255 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._20_4_ =
                     (fVar256 + auVar56._20_4_ * 0.6931472 +
                     fVar256 * fVar256 *
                     (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (
                                                  fVar256 * (fVar256 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._24_4_ =
                     (fVar301 + auVar56._24_4_ * 0.6931472 +
                     fVar301 * fVar301 *
                     (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (
                                                  fVar301 * (fVar301 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._28_4_ = auVar129._28_4_ + -1.0 + auVar272._28_4_ + auVar56._28_4_ + 0.0;
                auVar176._8_4_ = 0x7fffffff;
                auVar176._0_8_ = 0x7fffffff7fffffff;
                auVar176._12_4_ = 0x7fffffff;
                auVar176._16_4_ = 0x7fffffff;
                auVar176._20_4_ = 0x7fffffff;
                auVar176._24_4_ = 0x7fffffff;
                auVar176._28_4_ = 0x7fffffff;
                auVar272 = vblendvps_avx(auVar14,auVar176,auVar82);
                auVar272 = vminps_avx(auVar262,auVar272);
                auVar82 = vmaxps_avx(auVar265,auVar272);
                auVar177._0_4_ = auVar82._0_4_ * 1.442695 + fVar138;
                auVar177._4_4_ = auVar82._4_4_ * 1.442695 + fVar185;
                auVar177._8_4_ = auVar82._8_4_ * 1.442695 + fVar186;
                auVar177._12_4_ = auVar82._12_4_ * 1.442695 + fVar187;
                auVar177._16_4_ = auVar82._16_4_ * 1.442695 + fVar188;
                auVar177._20_4_ = auVar82._20_4_ * 1.442695 + fVar189;
                auVar177._24_4_ = auVar82._24_4_ * 1.442695 + fVar191;
                auVar177._28_4_ = fVar296 + NAN;
                auVar56 = vroundps_avx(auVar177,1);
                auVar272 = vcmpps_avx(auVar177,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                auVar15._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar15._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar15._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar15._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar15._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar15._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar15._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar15._28_4_ = auVar56._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar15);
                fVar251 = auVar82._0_4_;
                fVar252 = auVar82._4_4_;
                fVar253 = auVar82._8_4_;
                fVar254 = auVar82._12_4_;
                fVar255 = auVar82._16_4_;
                fVar256 = auVar82._20_4_;
                fVar301 = auVar82._24_4_;
                auVar267 = ZEXT3264(auVar209);
                auVar277 = ZEXT3264(auVar277._0_32_);
                fVar138 = fVar138 + ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 +
                                      0.008333452) * fVar251 + 0.041665796) * fVar251 + 0.16666666)
                                    * fVar251;
                fVar185 = fVar185 + ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 +
                                      0.008333452) * fVar252 + 0.041665796) * fVar252 + 0.16666666)
                                    * fVar252;
                fVar186 = fVar186 + ((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 +
                                      0.008333452) * fVar253 + 0.041665796) * fVar253 + 0.16666666)
                                    * fVar253;
                fVar187 = fVar187 + ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 +
                                      0.008333452) * fVar254 + 0.041665796) * fVar254 + 0.16666666)
                                    * fVar254;
                fVar188 = fVar188 + ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 +
                                      0.008333452) * fVar255 + 0.041665796) * fVar255 + 0.16666666)
                                    * fVar255;
                fVar189 = fVar189 + ((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 +
                                      0.008333452) * fVar256 + 0.041665796) * fVar256 + 0.16666666)
                                    * fVar256;
                fVar191 = fVar191 + ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 +
                                      0.008333452) * fVar301 + 0.041665796) * fVar301 + 0.16666666)
                                    * fVar301;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar296 + auVar242._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar191,CONCAT420(fVar189,CONCAT416(fVar188,
                                                  CONCAT412(fVar187,CONCAT48(fVar186,CONCAT44(
                                                  fVar185,fVar138))))))));
                auVar141._0_4_ = (int)auVar272._0_4_;
                auVar141._4_4_ = (int)auVar272._4_4_;
                auVar141._8_4_ = (int)auVar272._8_4_;
                auVar141._12_4_ = (int)auVar272._12_4_;
                auVar178._16_4_ = (int)auVar272._16_4_;
                auVar178._0_16_ = auVar141;
                auVar178._20_4_ = (int)auVar272._20_4_;
                auVar178._24_4_ = (int)auVar272._24_4_;
                auVar178._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar141,0x17);
                auVar139 = vpslld_avx(auVar178._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar64);
                auVar211 = vpaddd_avx(auVar211,auVar64);
                auVar131._0_4_ =
                     (fVar251 + fVar49 + fVar251 * fVar251 * fVar138) * auVar211._0_4_ + fVar49;
                auVar131._4_4_ =
                     (fVar252 + fVar63 + fVar252 * fVar252 * fVar185) * auVar211._4_4_ + fVar63;
                auVar131._8_4_ =
                     (fVar253 + fVar90 + fVar253 * fVar253 * fVar186) * auVar211._8_4_ + fVar90;
                auVar131._12_4_ =
                     (fVar254 + fVar91 + fVar254 * fVar254 * fVar187) * auVar211._12_4_ + fVar91;
                auVar131._16_4_ =
                     (fVar255 + fVar193 + fVar255 * fVar255 * fVar188) * auVar139._0_4_ + fVar193;
                auVar131._20_4_ =
                     (fVar256 + fVar92 + fVar256 * fVar256 * fVar189) * auVar139._4_4_ + fVar92;
                auVar131._24_4_ =
                     (fVar301 + fVar190 + fVar301 * fVar301 * fVar191) * auVar139._8_4_ + fVar190;
                auVar131._28_4_ = auVar82._28_4_ + fVar192 + auVar56._28_4_ + fVar192;
                auVar209 = vrcpps_avx(auVar131);
                fVar49 = auVar209._0_4_;
                fVar63 = auVar209._4_4_;
                fVar90 = auVar209._8_4_;
                fVar91 = auVar209._12_4_;
                fVar193 = auVar209._16_4_;
                fVar92 = auVar209._20_4_;
                fVar190 = auVar209._24_4_;
                auVar16._4_4_ = auVar131._4_4_ * (fVar63 + fVar63);
                auVar16._0_4_ = auVar131._0_4_ * (fVar49 + fVar49);
                auVar16._8_4_ = auVar131._8_4_ * (fVar90 + fVar90);
                auVar16._12_4_ = auVar131._12_4_ * (fVar91 + fVar91);
                auVar16._16_4_ = auVar131._16_4_ * (fVar193 + fVar193);
                auVar16._20_4_ = auVar131._20_4_ * (fVar92 + fVar92);
                auVar16._24_4_ = auVar131._24_4_ * (fVar190 + fVar190);
                auVar16._28_4_ = auVar131._28_4_;
                auVar83._8_4_ = 0x40000000;
                auVar83._0_8_ = 0x4000000040000000;
                auVar83._12_4_ = 0x40000000;
                auVar83._16_4_ = 0x40000000;
                auVar83._20_4_ = 0x40000000;
                auVar83._24_4_ = 0x40000000;
                auVar83._28_4_ = 0x40000000;
                auVar272 = vsubps_avx(auVar83,auVar16);
                auVar179._0_4_ = fVar49 + fVar49 + -1.0;
                auVar179._4_4_ = fVar63 + fVar63 + -1.0;
                auVar179._8_4_ = fVar90 + fVar90 + -1.0;
                auVar179._12_4_ = fVar91 + fVar91 + -1.0;
                auVar179._16_4_ = fVar193 + fVar193 + -1.0;
                auVar179._20_4_ = fVar92 + fVar92 + -1.0;
                auVar179._24_4_ = fVar190 + fVar190 + -1.0;
                auVar179._28_4_ = auVar209._28_4_ + auVar209._28_4_ + -1.0;
                auVar121._0_4_ = auVar179._0_4_ + fVar49 * auVar272._0_4_;
                auVar121._4_4_ = auVar179._4_4_ + fVar63 * auVar272._4_4_;
                auVar121._8_4_ = auVar179._8_4_ + fVar90 * auVar272._8_4_;
                auVar121._12_4_ = auVar179._12_4_ + fVar91 * auVar272._12_4_;
                auVar121._16_4_ = auVar179._16_4_ + fVar193 * auVar272._16_4_;
                auVar121._20_4_ = auVar179._20_4_ + fVar92 * auVar272._20_4_;
                auVar121._24_4_ = auVar179._24_4_ + fVar190 * auVar272._24_4_;
                goto LAB_003092c6;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar179._4_4_ = fVar63;
                auVar179._0_4_ = fVar63;
                auVar179._8_4_ = fVar63;
                auVar179._12_4_ = fVar63;
                auVar179._16_4_ = fVar63;
                auVar179._20_4_ = fVar63;
                auVar179._24_4_ = fVar63;
                auVar179._28_4_ = fVar63;
                auVar133._0_4_ = auVar278._0_4_ * fVar49 + fVar63;
                auVar133._4_4_ = auVar278._4_4_ * fVar49 + fVar63;
                auVar133._8_4_ = fVar297 * fVar49 + fVar63;
                auVar133._12_4_ = fVar298 * fVar49 + fVar63;
                auVar133._16_4_ = fVar299 * fVar49 + fVar63;
                auVar133._20_4_ = fVar300 * fVar49 + fVar63;
                auVar133._24_4_ = fVar210 * fVar49 + fVar63;
                auVar133._28_4_ = fVar49 + fVar63;
                auVar272 = vmaxps_avx(auVar133,auVar89._0_32_);
                auVar209 = vminps_avx(auVar272,auVar209);
                auVar121 = auVar209._0_28_;
LAB_003092c6:
                in_ZMM3 = ZEXT3264(auVar179);
                auVar279._0_4_ = auVar278._0_4_ * auVar121._0_4_;
                auVar279._4_4_ = auVar278._4_4_ * auVar121._4_4_;
                auVar279._8_4_ = fVar297 * auVar121._8_4_;
                auVar279._12_4_ = fVar298 * auVar121._12_4_;
                auVar279._16_4_ = fVar299 * auVar121._16_4_;
                auVar279._20_4_ = fVar300 * auVar121._20_4_;
                auVar279._24_4_ = fVar210 * auVar121._24_4_;
                auVar274 = auVar279._0_32_;
              }
              *pauVar34 = auVar274;
              pauVar34 = pauVar34 + 1;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      if ((bVar46 && bVar44) && iVar2 == 4) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_120 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar277 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar267 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar263._8_4_ = 0x42b0c0a5;
        auVar263._0_8_ = 0x42b0c0a542b0c0a5;
        auVar263._12_4_ = 0x42b0c0a5;
        auVar263._16_4_ = 0x42b0c0a5;
        auVar263._20_4_ = 0x42b0c0a5;
        auVar263._24_4_ = 0x42b0c0a5;
        auVar263._28_4_ = 0x42b0c0a5;
        auVar266._8_4_ = 0xc2b0c0a5;
        auVar266._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar266._12_4_ = 0xc2b0c0a5;
        auVar266._16_4_ = 0xc2b0c0a5;
        auVar266._20_4_ = 0xc2b0c0a5;
        auVar266._24_4_ = 0xc2b0c0a5;
        auVar266._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_120 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar278 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar278 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_120 * 0x20));
              }
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_120 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4
                                     + 4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-3];
                      fVar63 = pfVar31[-2];
                      fVar90 = pfVar31[-1];
                      fVar91 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar91,CONCAT420(fVar91,
                                                  CONCAT416(fVar91,CONCAT412(fVar91,CONCAT48(fVar91,
                                                  CONCAT44(fVar91,fVar91))))))));
                      fVar193 = fVar63 + fVar90;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar91 * pfVar43[0x1e],
                                                                     CONCAT420(fVar91 * pfVar43[0x1d
                                                  ],CONCAT416(fVar91 * pfVar43[0x1c],
                                                              CONCAT412(fVar91 * pfVar43[0x1b],
                                                                        CONCAT48(fVar91 * pfVar43[
                                                  0x1a],CONCAT44(fVar91 * pfVar43[0x19],
                                                                 fVar91 * pfVar43[0x18]))))))));
                      auVar278 = ZEXT3264(CONCAT428(auVar278._28_4_ + fVar49 + fVar193 + fVar193,
                                                    CONCAT424(auVar278._24_4_ + fVar49 * pfVar43[6]
                                                              + fVar63 * pfVar43[0xe] +
                                                                fVar90 * pfVar43[0x16] +
                                                              fVar91 * pfVar43[0x1e],
                                                              CONCAT420(auVar278._20_4_ +
                                                                        fVar49 * pfVar43[5] +
                                                                        fVar63 * pfVar43[0xd] +
                                                                        fVar90 * pfVar43[0x15] +
                                                                        fVar91 * pfVar43[0x1d],
                                                                        CONCAT416(auVar278._16_4_ +
                                                                                  fVar49 * pfVar43[4
                                                  ] + fVar63 * pfVar43[0xc] + fVar90 * pfVar43[0x14]
                                                  + fVar91 * pfVar43[0x1c],
                                                  CONCAT412(auVar278._12_4_ + fVar49 * pfVar43[3] +
                                                            fVar63 * pfVar43[0xb] +
                                                            fVar90 * pfVar43[0x13] +
                                                            fVar91 * pfVar43[0x1b],
                                                            CONCAT48(auVar278._8_4_ +
                                                                     fVar49 * pfVar43[2] +
                                                                     fVar63 * pfVar43[10] +
                                                                     fVar90 * pfVar43[0x12] +
                                                                     fVar91 * pfVar43[0x1a],
                                                                     CONCAT44(auVar278._4_4_ +
                                                                              fVar49 * pfVar43[1] +
                                                                              fVar63 * pfVar43[9] +
                                                                              fVar90 * pfVar43[0x11]
                                                                              + fVar91 * pfVar43[
                                                  0x19],auVar278._0_4_ + fVar49 * *pfVar43 +
                                                        fVar63 * pfVar43[8] + fVar90 * pfVar43[0x10]
                                                        + fVar91 * pfVar43[0x18]))))))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar276 = auVar278._0_32_;
              fVar297 = auVar278._8_4_;
              fVar298 = auVar278._12_4_;
              fVar299 = auVar278._16_4_;
              fVar300 = auVar278._20_4_;
              fVar210 = auVar278._24_4_;
              fVar138 = auVar277._0_4_;
              fVar185 = auVar277._4_4_;
              fVar186 = auVar277._8_4_;
              fVar187 = auVar277._12_4_;
              fVar188 = auVar277._16_4_;
              fVar189 = auVar277._20_4_;
              fVar191 = auVar277._24_4_;
              fVar296 = auVar277._28_4_;
              auVar209 = auVar267._0_32_;
              fVar49 = auVar267._0_4_;
              fVar63 = auVar267._4_4_;
              fVar90 = auVar267._8_4_;
              fVar91 = auVar267._12_4_;
              fVar193 = auVar267._16_4_;
              fVar92 = auVar267._20_4_;
              fVar190 = auVar267._24_4_;
              fVar192 = auVar267._28_4_;
              auVar280._28_36_ = auVar278._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar276 = vmaxps_avx(auVar276,auVar89._0_32_);
                break;
              case 2:
                auVar209 = vmaxps_avx(auVar276,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar209);
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar272 = vminps_avx(auVar276,ZEXT1632(ZEXT816(0) << 0x40));
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar276._0_4_ = fVar49 * auVar272._0_4_ + auVar209._0_4_;
                auVar276._4_4_ = fVar49 * auVar272._4_4_ + auVar209._4_4_;
                auVar276._8_4_ = fVar49 * auVar272._8_4_ + auVar209._8_4_;
                auVar276._12_4_ = fVar49 * auVar272._12_4_ + auVar209._12_4_;
                auVar276._16_4_ = fVar49 * auVar272._16_4_ + auVar209._16_4_;
                auVar276._20_4_ = fVar49 * auVar272._20_4_ + auVar209._20_4_;
                auVar276._24_4_ = fVar49 * auVar272._24_4_ + auVar209._24_4_;
                auVar276._28_4_ = auVar272._28_4_ + auVar209._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar248._4_4_ = uVar1;
                auVar248._0_4_ = uVar1;
                auVar248._8_4_ = uVar1;
                auVar248._12_4_ = uVar1;
                auVar248._16_4_ = uVar1;
                auVar248._20_4_ = uVar1;
                auVar248._24_4_ = uVar1;
                auVar248._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar295._4_4_ = uVar1;
                auVar295._0_4_ = uVar1;
                auVar295._8_4_ = uVar1;
                auVar295._12_4_ = uVar1;
                auVar295._16_4_ = uVar1;
                auVar295._20_4_ = uVar1;
                auVar295._24_4_ = uVar1;
                auVar295._28_4_ = uVar1;
                auVar209 = vmaxps_avx(auVar276,auVar248);
                in_ZMM7 = ZEXT3264(auVar209);
                auVar276 = vminps_avx(auVar295,auVar209);
                break;
              case 4:
                auVar249._0_8_ = auVar278._0_8_ ^ 0x8000000080000000;
                auVar249._8_4_ = -fVar297;
                auVar249._12_4_ = -fVar298;
                auVar249._16_4_ = -fVar299;
                auVar249._20_4_ = -fVar300;
                auVar249._24_4_ = -fVar210;
                auVar249._28_4_ = -auVar278._28_4_;
                auVar87._8_4_ = 0x42b0c0a5;
                auVar87._0_8_ = 0x42b0c0a542b0c0a5;
                auVar87._12_4_ = 0x42b0c0a5;
                auVar87._16_4_ = 0x42b0c0a5;
                auVar87._20_4_ = 0x42b0c0a5;
                auVar87._24_4_ = 0x42b0c0a5;
                auVar87._28_4_ = 0x42b0c0a5;
                auVar272 = vminps_avx(auVar249,auVar87);
                auVar88._8_4_ = 0xc2b0c0a5;
                auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar88._12_4_ = 0xc2b0c0a5;
                auVar88._16_4_ = 0xc2b0c0a5;
                auVar88._20_4_ = 0xc2b0c0a5;
                auVar88._24_4_ = 0xc2b0c0a5;
                auVar88._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar272,auVar88);
                auVar275._0_4_ = auVar82._0_4_ * 1.442695 + fVar138;
                auVar275._4_4_ = auVar82._4_4_ * 1.442695 + fVar185;
                auVar275._8_4_ = auVar82._8_4_ * 1.442695 + fVar186;
                auVar275._12_4_ = auVar82._12_4_ * 1.442695 + fVar187;
                auVar275._16_4_ = auVar82._16_4_ * 1.442695 + fVar188;
                auVar275._20_4_ = auVar82._20_4_ * 1.442695 + fVar189;
                auVar275._24_4_ = auVar82._24_4_ * 1.442695 + fVar191;
                auVar275._28_4_ = auVar278._28_4_ + fVar296;
                auVar56 = vroundps_avx(auVar275,1);
                auVar272 = vcmpps_avx(auVar275,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                fVar297 = auVar272._0_4_ * -0.6931472 + auVar82._0_4_;
                fVar298 = auVar272._4_4_ * -0.6931472 + auVar82._4_4_;
                fVar299 = auVar272._8_4_ * -0.6931472 + auVar82._8_4_;
                fVar300 = auVar272._12_4_ * -0.6931472 + auVar82._12_4_;
                fVar210 = auVar272._16_4_ * -0.6931472 + auVar82._16_4_;
                fVar251 = auVar272._20_4_ * -0.6931472 + auVar82._20_4_;
                fVar252 = auVar272._24_4_ * -0.6931472 + auVar82._24_4_;
                auVar214._0_4_ = (int)auVar272._0_4_;
                auVar214._4_4_ = (int)auVar272._4_4_;
                auVar214._8_4_ = (int)auVar272._8_4_;
                auVar214._12_4_ = (int)auVar272._12_4_;
                auVar250._16_4_ = (int)auVar272._16_4_;
                auVar250._0_16_ = auVar214;
                auVar250._20_4_ = (int)auVar272._20_4_;
                auVar250._24_4_ = (int)auVar272._24_4_;
                auVar250._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar214,0x17);
                auVar139 = vpslld_avx(auVar250._16_16_,0x17);
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = 0x3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar67);
                auVar211 = vpaddd_avx(auVar211,auVar67);
                auVar136._0_4_ =
                     (fVar297 + fVar49 +
                     fVar297 * fVar297 *
                     (fVar138 +
                     ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                      + 0.041665796) * fVar297 + 0.16666666) * fVar297)) * auVar211._0_4_ + fVar49;
                auVar136._4_4_ =
                     (fVar298 + fVar63 +
                     fVar298 * fVar298 *
                     (fVar185 +
                     ((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) * fVar298
                      + 0.041665796) * fVar298 + 0.16666666) * fVar298)) * auVar211._4_4_ + fVar63;
                auVar136._8_4_ =
                     (fVar299 + fVar90 +
                     fVar299 * fVar299 *
                     (fVar186 +
                     ((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) * fVar299
                      + 0.041665796) * fVar299 + 0.16666666) * fVar299)) * auVar211._8_4_ + fVar90;
                auVar136._12_4_ =
                     (fVar300 + fVar91 +
                     fVar300 * fVar300 *
                     (fVar187 +
                     ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                      + 0.041665796) * fVar300 + 0.16666666) * fVar300)) * auVar211._12_4_ + fVar91;
                auVar136._16_4_ =
                     (fVar210 + fVar193 +
                     fVar210 * fVar210 *
                     (fVar188 +
                     ((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210
                      + 0.041665796) * fVar210 + 0.16666666) * fVar210)) * auVar139._0_4_ + fVar193;
                auVar136._20_4_ =
                     (fVar251 + fVar92 +
                     fVar251 * fVar251 *
                     (fVar189 +
                     ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                      + 0.041665796) * fVar251 + 0.16666666) * fVar251)) * auVar139._4_4_ + fVar92;
                auVar136._24_4_ =
                     (fVar252 + fVar190 +
                     fVar252 * fVar252 *
                     (fVar191 +
                     ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                      + 0.041665796) * fVar252 + 0.16666666) * fVar252)) * auVar139._8_4_ + fVar190;
                auVar136._28_4_ =
                     auVar56._28_4_ + auVar82._28_4_ + fVar192 + fVar296 + -0.47508308 + fVar192;
                auVar272 = vrcpps_avx(auVar136);
                in_ZMM7 = ZEXT3264(auVar272);
                fVar49 = auVar272._0_4_;
                fVar63 = auVar272._4_4_;
                auVar22._4_4_ = auVar136._4_4_ * fVar63;
                auVar22._0_4_ = auVar136._0_4_ * fVar49;
                fVar90 = auVar272._8_4_;
                auVar22._8_4_ = auVar136._8_4_ * fVar90;
                fVar91 = auVar272._12_4_;
                auVar22._12_4_ = auVar136._12_4_ * fVar91;
                fVar193 = auVar272._16_4_;
                auVar22._16_4_ = auVar136._16_4_ * fVar193;
                fVar92 = auVar272._20_4_;
                auVar22._20_4_ = auVar136._20_4_ * fVar92;
                fVar190 = auVar272._24_4_;
                auVar22._24_4_ = auVar136._24_4_ * fVar190;
                auVar22._28_4_ = auVar136._28_4_;
                auVar209 = vsubps_avx(auVar209,auVar22);
                auVar276._0_4_ = fVar49 + fVar49 * auVar209._0_4_;
                auVar276._4_4_ = fVar63 + fVar63 * auVar209._4_4_;
                auVar276._8_4_ = fVar90 + fVar90 * auVar209._8_4_;
                auVar276._12_4_ = fVar91 + fVar91 * auVar209._12_4_;
                auVar276._16_4_ = fVar193 + fVar193 * auVar209._16_4_;
                auVar276._20_4_ = fVar92 + fVar92 * auVar209._20_4_;
                auVar276._24_4_ = fVar190 + fVar190 * auVar209._24_4_;
                auVar276._28_4_ = auVar272._28_4_ + auVar209._28_4_;
                break;
              case 5:
                auVar272 = vminps_avx(auVar276,auVar263);
                auVar82 = vmaxps_avx(auVar266,auVar272);
                auVar246._0_4_ = fVar138 + auVar82._0_4_ * 1.442695;
                auVar246._4_4_ = fVar185 + auVar82._4_4_ * 1.442695;
                auVar246._8_4_ = fVar186 + auVar82._8_4_ * 1.442695;
                auVar246._12_4_ = fVar187 + auVar82._12_4_ * 1.442695;
                auVar246._16_4_ = fVar188 + auVar82._16_4_ * 1.442695;
                auVar246._20_4_ = fVar189 + auVar82._20_4_ * 1.442695;
                auVar246._24_4_ = fVar191 + auVar82._24_4_ * 1.442695;
                auVar246._28_4_ = fVar296 + in_ZMM7._28_4_;
                auVar56 = vroundps_avx(auVar246,1);
                auVar272 = vcmpps_avx(auVar246,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                auVar18._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar18._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar18._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar18._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar18._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar18._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar18._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar18._28_4_ = auVar56._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar18);
                fVar251 = auVar82._0_4_;
                fVar252 = auVar82._4_4_;
                fVar253 = auVar82._8_4_;
                fVar254 = auVar82._12_4_;
                fVar255 = auVar82._16_4_;
                fVar256 = auVar82._20_4_;
                fVar301 = auVar82._24_4_;
                auVar142._0_4_ = (int)auVar272._0_4_;
                auVar142._4_4_ = (int)auVar272._4_4_;
                auVar142._8_4_ = (int)auVar272._8_4_;
                auVar142._12_4_ = (int)auVar272._12_4_;
                auVar180._16_4_ = (int)auVar272._16_4_;
                auVar180._0_16_ = auVar142;
                auVar180._20_4_ = (int)auVar272._20_4_;
                auVar180._24_4_ = (int)auVar272._24_4_;
                auVar180._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar142,0x17);
                auVar139 = vpslld_avx(auVar180._16_16_,0x17);
                auVar204._8_4_ = 0x3f800000;
                auVar204._0_8_ = 0x3f8000003f800000;
                auVar204._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar204);
                auVar211 = vpaddd_avx(auVar211,auVar204);
                auVar247._0_4_ =
                     (fVar251 + fVar49 +
                     fVar251 * fVar251 *
                     (((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                       + 0.041665796) * fVar251 + 0.16666666) * fVar251 + fVar138)) * auVar211._0_4_
                     + fVar49;
                auVar247._4_4_ =
                     (fVar252 + fVar63 +
                     fVar252 * fVar252 *
                     (((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                       + 0.041665796) * fVar252 + 0.16666666) * fVar252 + fVar185)) * auVar211._4_4_
                     + fVar63;
                auVar247._8_4_ =
                     (fVar253 + fVar90 +
                     fVar253 * fVar253 *
                     (((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 + 0.008333452) * fVar253
                       + 0.041665796) * fVar253 + 0.16666666) * fVar253 + fVar186)) * auVar211._8_4_
                     + fVar90;
                auVar247._12_4_ =
                     (fVar254 + fVar91 +
                     fVar254 * fVar254 *
                     (((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                       + 0.041665796) * fVar254 + 0.16666666) * fVar254 + fVar187)) *
                     auVar211._12_4_ + fVar91;
                auVar247._16_4_ =
                     (fVar255 + fVar193 +
                     fVar255 * fVar255 *
                     (((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                       + 0.041665796) * fVar255 + 0.16666666) * fVar255 + fVar188)) * auVar139._0_4_
                     + fVar193;
                auVar247._20_4_ =
                     (fVar256 + fVar92 +
                     fVar256 * fVar256 *
                     (((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 + 0.008333452) * fVar256
                       + 0.041665796) * fVar256 + 0.16666666) * fVar256 + fVar189)) * auVar139._4_4_
                     + fVar92;
                auVar247._24_4_ =
                     (fVar301 + fVar190 +
                     fVar301 * fVar301 *
                     (((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301
                       + 0.041665796) * fVar301 + 0.16666666) * fVar301 + fVar191)) * auVar139._8_4_
                     + fVar190;
                auVar247._28_4_ =
                     auVar82._28_4_ + fVar192 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar296 + fVar192;
                auVar60._8_4_ = 0x800000;
                auVar60._0_8_ = 0x80000000800000;
                auVar60._12_4_ = 0x800000;
                auVar60._16_4_ = 0x800000;
                auVar60._20_4_ = 0x800000;
                auVar60._24_4_ = 0x800000;
                auVar60._28_4_ = 0x800000;
                auVar56 = vmaxps_avx(auVar247,auVar60);
                auVar139 = vpsrld_avx(auVar56._16_16_,0x17);
                auVar61._8_4_ = 0x807fffff;
                auVar61._0_8_ = 0x807fffff807fffff;
                auVar61._12_4_ = 0x807fffff;
                auVar61._16_4_ = 0x807fffff;
                auVar61._20_4_ = 0x807fffff;
                auVar61._24_4_ = 0x807fffff;
                auVar61._28_4_ = 0x807fffff;
                auVar272 = vandps_avx(auVar56,auVar61);
                auVar129 = vorps_avx(auVar272,auVar277._0_32_);
                auVar62._8_4_ = 0x3f3504f3;
                auVar62._0_8_ = 0x3f3504f33f3504f3;
                auVar62._12_4_ = 0x3f3504f3;
                auVar62._16_4_ = 0x3f3504f3;
                auVar62._20_4_ = 0x3f3504f3;
                auVar62._24_4_ = 0x3f3504f3;
                auVar62._28_4_ = 0x3f3504f3;
                auVar82 = vcmpps_avx(auVar62,auVar129,2);
                auVar272 = vandnps_avx(auVar82,auVar129);
                fVar251 = auVar129._0_4_ + -1.0 + auVar272._0_4_;
                fVar252 = auVar129._4_4_ + -1.0 + auVar272._4_4_;
                fVar253 = auVar129._8_4_ + -1.0 + auVar272._8_4_;
                fVar254 = auVar129._12_4_ + -1.0 + auVar272._12_4_;
                fVar255 = auVar129._16_4_ + -1.0 + auVar272._16_4_;
                fVar256 = auVar129._20_4_ + -1.0 + auVar272._20_4_;
                fVar301 = auVar129._24_4_ + -1.0 + auVar272._24_4_;
                auVar139 = vpsubd_avx(auVar139,auVar82._16_16_);
                auVar211 = vpsrld_avx(auVar56._0_16_,0x17);
                auVar52._8_4_ = 0xffffff81;
                auVar52._0_8_ = 0xffffff81ffffff81;
                auVar52._12_4_ = 0xffffff81;
                auVar139 = vpaddd_avx(auVar139,auVar52);
                auVar211 = vpsubd_avx(auVar211,auVar82._0_16_);
                auVar211 = vpaddd_avx(auVar211,auVar52);
                auVar134._16_16_ = auVar139;
                auVar134._0_16_ = auVar211;
                auVar89 = ZEXT864(0) << 0x20;
                auVar82 = vcmpps_avx(auVar247,ZEXT832(0) << 0x20,2);
                auVar56 = vcvtdq2ps_avx(auVar134);
                auVar19._4_4_ =
                     (fVar252 + auVar56._4_4_ * 0.6931472 +
                     fVar252 * fVar252 *
                     (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (
                                                  fVar252 * (fVar252 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._0_4_ =
                     (fVar251 + auVar56._0_4_ * 0.6931472 +
                     fVar251 * fVar251 *
                     (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (
                                                  fVar251 * (fVar251 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._8_4_ =
                     (fVar253 + auVar56._8_4_ * 0.6931472 +
                     fVar253 * fVar253 *
                     (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (
                                                  fVar253 * (fVar253 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._12_4_ =
                     (fVar254 + auVar56._12_4_ * 0.6931472 +
                     fVar254 * fVar254 *
                     (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (
                                                  fVar254 * (fVar254 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._16_4_ =
                     (fVar255 + auVar56._16_4_ * 0.6931472 +
                     fVar255 * fVar255 *
                     (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (
                                                  fVar255 * (fVar255 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._20_4_ =
                     (fVar256 + auVar56._20_4_ * 0.6931472 +
                     fVar256 * fVar256 *
                     (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (
                                                  fVar256 * (fVar256 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._24_4_ =
                     (fVar301 + auVar56._24_4_ * 0.6931472 +
                     fVar301 * fVar301 *
                     (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (
                                                  fVar301 * (fVar301 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._28_4_ = auVar129._28_4_ + -1.0 + auVar272._28_4_ + auVar56._28_4_ + 0.0;
                auVar181._8_4_ = 0x7fffffff;
                auVar181._0_8_ = 0x7fffffff7fffffff;
                auVar181._12_4_ = 0x7fffffff;
                auVar181._16_4_ = 0x7fffffff;
                auVar181._20_4_ = 0x7fffffff;
                auVar181._24_4_ = 0x7fffffff;
                auVar181._28_4_ = 0x7fffffff;
                auVar272 = vblendvps_avx(auVar19,auVar181,auVar82);
                auVar272 = vminps_avx(auVar263,auVar272);
                auVar82 = vmaxps_avx(auVar266,auVar272);
                auVar182._0_4_ = auVar82._0_4_ * 1.442695 + fVar138;
                auVar182._4_4_ = auVar82._4_4_ * 1.442695 + fVar185;
                auVar182._8_4_ = auVar82._8_4_ * 1.442695 + fVar186;
                auVar182._12_4_ = auVar82._12_4_ * 1.442695 + fVar187;
                auVar182._16_4_ = auVar82._16_4_ * 1.442695 + fVar188;
                auVar182._20_4_ = auVar82._20_4_ * 1.442695 + fVar189;
                auVar182._24_4_ = auVar82._24_4_ * 1.442695 + fVar191;
                auVar182._28_4_ = fVar296 + NAN;
                auVar56 = vroundps_avx(auVar182,1);
                auVar272 = vcmpps_avx(auVar182,auVar56,1);
                auVar272 = vandps_avx(auVar272,auVar209);
                auVar272 = vsubps_avx(auVar56,auVar272);
                auVar20._4_4_ = auVar272._4_4_ * 0.6931472;
                auVar20._0_4_ = auVar272._0_4_ * 0.6931472;
                auVar20._8_4_ = auVar272._8_4_ * 0.6931472;
                auVar20._12_4_ = auVar272._12_4_ * 0.6931472;
                auVar20._16_4_ = auVar272._16_4_ * 0.6931472;
                auVar20._20_4_ = auVar272._20_4_ * 0.6931472;
                auVar20._24_4_ = auVar272._24_4_ * 0.6931472;
                auVar20._28_4_ = auVar56._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar20);
                fVar251 = auVar82._0_4_;
                fVar252 = auVar82._4_4_;
                fVar253 = auVar82._8_4_;
                fVar254 = auVar82._12_4_;
                fVar255 = auVar82._16_4_;
                fVar256 = auVar82._20_4_;
                fVar301 = auVar82._24_4_;
                auVar267 = ZEXT3264(auVar209);
                auVar277 = ZEXT3264(auVar277._0_32_);
                fVar138 = fVar138 + ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 +
                                      0.008333452) * fVar251 + 0.041665796) * fVar251 + 0.16666666)
                                    * fVar251;
                fVar185 = fVar185 + ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 +
                                      0.008333452) * fVar252 + 0.041665796) * fVar252 + 0.16666666)
                                    * fVar252;
                fVar186 = fVar186 + ((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 +
                                      0.008333452) * fVar253 + 0.041665796) * fVar253 + 0.16666666)
                                    * fVar253;
                fVar187 = fVar187 + ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 +
                                      0.008333452) * fVar254 + 0.041665796) * fVar254 + 0.16666666)
                                    * fVar254;
                fVar188 = fVar188 + ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 +
                                      0.008333452) * fVar255 + 0.041665796) * fVar255 + 0.16666666)
                                    * fVar255;
                fVar189 = fVar189 + ((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 +
                                      0.008333452) * fVar256 + 0.041665796) * fVar256 + 0.16666666)
                                    * fVar256;
                fVar191 = fVar191 + ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 +
                                      0.008333452) * fVar301 + 0.041665796) * fVar301 + 0.16666666)
                                    * fVar301;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar296 + auVar247._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar191,CONCAT420(fVar189,CONCAT416(fVar188,
                                                  CONCAT412(fVar187,CONCAT48(fVar186,CONCAT44(
                                                  fVar185,fVar138))))))));
                auVar143._0_4_ = (int)auVar272._0_4_;
                auVar143._4_4_ = (int)auVar272._4_4_;
                auVar143._8_4_ = (int)auVar272._8_4_;
                auVar143._12_4_ = (int)auVar272._12_4_;
                auVar183._16_4_ = (int)auVar272._16_4_;
                auVar183._0_16_ = auVar143;
                auVar183._20_4_ = (int)auVar272._20_4_;
                auVar183._24_4_ = (int)auVar272._24_4_;
                auVar183._28_4_ = (int)auVar272._28_4_;
                auVar211 = vpslld_avx(auVar143,0x17);
                auVar139 = vpslld_avx(auVar183._16_16_,0x17);
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = 0x3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar139 = vpaddd_avx(auVar139,auVar66);
                auVar211 = vpaddd_avx(auVar211,auVar66);
                auVar135._0_4_ =
                     (fVar251 + fVar49 + fVar251 * fVar251 * fVar138) * auVar211._0_4_ + fVar49;
                auVar135._4_4_ =
                     (fVar252 + fVar63 + fVar252 * fVar252 * fVar185) * auVar211._4_4_ + fVar63;
                auVar135._8_4_ =
                     (fVar253 + fVar90 + fVar253 * fVar253 * fVar186) * auVar211._8_4_ + fVar90;
                auVar135._12_4_ =
                     (fVar254 + fVar91 + fVar254 * fVar254 * fVar187) * auVar211._12_4_ + fVar91;
                auVar135._16_4_ =
                     (fVar255 + fVar193 + fVar255 * fVar255 * fVar188) * auVar139._0_4_ + fVar193;
                auVar135._20_4_ =
                     (fVar256 + fVar92 + fVar256 * fVar256 * fVar189) * auVar139._4_4_ + fVar92;
                auVar135._24_4_ =
                     (fVar301 + fVar190 + fVar301 * fVar301 * fVar191) * auVar139._8_4_ + fVar190;
                auVar135._28_4_ = auVar82._28_4_ + fVar192 + auVar56._28_4_ + fVar192;
                auVar209 = vrcpps_avx(auVar135);
                fVar49 = auVar209._0_4_;
                fVar63 = auVar209._4_4_;
                fVar90 = auVar209._8_4_;
                fVar91 = auVar209._12_4_;
                fVar193 = auVar209._16_4_;
                fVar92 = auVar209._20_4_;
                fVar190 = auVar209._24_4_;
                auVar21._4_4_ = auVar135._4_4_ * (fVar63 + fVar63);
                auVar21._0_4_ = auVar135._0_4_ * (fVar49 + fVar49);
                auVar21._8_4_ = auVar135._8_4_ * (fVar90 + fVar90);
                auVar21._12_4_ = auVar135._12_4_ * (fVar91 + fVar91);
                auVar21._16_4_ = auVar135._16_4_ * (fVar193 + fVar193);
                auVar21._20_4_ = auVar135._20_4_ * (fVar92 + fVar92);
                auVar21._24_4_ = auVar135._24_4_ * (fVar190 + fVar190);
                auVar21._28_4_ = auVar135._28_4_;
                auVar86._8_4_ = 0x40000000;
                auVar86._0_8_ = 0x4000000040000000;
                auVar86._12_4_ = 0x40000000;
                auVar86._16_4_ = 0x40000000;
                auVar86._20_4_ = 0x40000000;
                auVar86._24_4_ = 0x40000000;
                auVar86._28_4_ = 0x40000000;
                auVar272 = vsubps_avx(auVar86,auVar21);
                auVar184._0_4_ = fVar49 + fVar49 + -1.0;
                auVar184._4_4_ = fVar63 + fVar63 + -1.0;
                auVar184._8_4_ = fVar90 + fVar90 + -1.0;
                auVar184._12_4_ = fVar91 + fVar91 + -1.0;
                auVar184._16_4_ = fVar193 + fVar193 + -1.0;
                auVar184._20_4_ = fVar92 + fVar92 + -1.0;
                auVar184._24_4_ = fVar190 + fVar190 + -1.0;
                auVar184._28_4_ = auVar209._28_4_ + auVar209._28_4_ + -1.0;
                auVar122._0_4_ = auVar184._0_4_ + fVar49 * auVar272._0_4_;
                auVar122._4_4_ = auVar184._4_4_ + fVar63 * auVar272._4_4_;
                auVar122._8_4_ = auVar184._8_4_ + fVar90 * auVar272._8_4_;
                auVar122._12_4_ = auVar184._12_4_ + fVar91 * auVar272._12_4_;
                auVar122._16_4_ = auVar184._16_4_ + fVar193 * auVar272._16_4_;
                auVar122._20_4_ = auVar184._20_4_ + fVar92 * auVar272._20_4_;
                auVar122._24_4_ = auVar184._24_4_ + fVar190 * auVar272._24_4_;
                goto LAB_00309963;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar184._4_4_ = fVar63;
                auVar184._0_4_ = fVar63;
                auVar184._8_4_ = fVar63;
                auVar184._12_4_ = fVar63;
                auVar184._16_4_ = fVar63;
                auVar184._20_4_ = fVar63;
                auVar184._24_4_ = fVar63;
                auVar184._28_4_ = fVar63;
                auVar137._0_4_ = auVar278._0_4_ * fVar49 + fVar63;
                auVar137._4_4_ = auVar278._4_4_ * fVar49 + fVar63;
                auVar137._8_4_ = fVar297 * fVar49 + fVar63;
                auVar137._12_4_ = fVar298 * fVar49 + fVar63;
                auVar137._16_4_ = fVar299 * fVar49 + fVar63;
                auVar137._20_4_ = fVar300 * fVar49 + fVar63;
                auVar137._24_4_ = fVar210 * fVar49 + fVar63;
                auVar137._28_4_ = fVar49 + fVar63;
                auVar272 = vmaxps_avx(auVar137,auVar89._0_32_);
                auVar209 = vminps_avx(auVar272,auVar209);
                auVar122 = auVar209._0_28_;
LAB_00309963:
                in_ZMM3 = ZEXT3264(auVar184);
                auVar280._0_4_ = auVar278._0_4_ * auVar122._0_4_;
                auVar280._4_4_ = auVar278._4_4_ * auVar122._4_4_;
                auVar280._8_4_ = fVar297 * auVar122._8_4_;
                auVar280._12_4_ = fVar298 * auVar122._12_4_;
                auVar280._16_4_ = fVar299 * auVar122._16_4_;
                auVar280._20_4_ = fVar300 * auVar122._20_4_;
                auVar280._24_4_ = fVar210 * auVar122._24_4_;
                auVar276 = auVar280._0_32_;
              }
              *pauVar34 = auVar276;
              pauVar34 = pauVar34 + 1;
              iVar39 = iVar39 + 4;
              bVar46 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar46);
          }
          local_120 = local_120 + 1;
        } while (local_120 != uVar27);
      }
      bVar46 = 0 < (int)uVar27;
      bVar44 = iVar29 == 1;
      if (iVar2 == 8 && (bVar44 && bVar46)) {
        local_58 = top_blob->data;
        local_60 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_68 = (this->weight_data_packed).data;
        local_70 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_50 = (ulong)uVar27;
        local_110 = 0;
        do {
          pvVar26 = local_58;
          pvVar24 = local_b8.data;
          if (-1 < iVar3) {
            lVar42 = local_60 * local_110;
            pfVar32 = (float *)(local_70 * local_110 + (long)local_68);
            lVar40 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            uVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar49 = 0.0;
              }
              else {
                fVar49 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + local_110 * 4);
              }
              if (iVar25 < 1) {
                fVar63 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                fVar193 = 0.0;
                fVar92 = 0.0;
                fVar190 = 0.0;
                fVar192 = 0.0;
                fVar138 = 0.0;
              }
              else {
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar24 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                fVar63 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                fVar193 = 0.0;
                fVar92 = 0.0;
                fVar190 = 0.0;
                fVar192 = 0.0;
                fVar138 = 0.0;
                uVar36 = 0;
                pfVar31 = pfVar32;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar38 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar63 = *pfVar31 * *pfVar38 + fVar63;
                      fVar90 = pfVar31[1] * pfVar38[1] + fVar90;
                      fVar91 = pfVar31[2] * pfVar38[2] + fVar91;
                      fVar193 = pfVar31[3] * pfVar38[3] + fVar193;
                      fVar92 = pfVar31[4] * pfVar38[4] + fVar92;
                      fVar190 = pfVar31[5] * pfVar38[5] + fVar190;
                      fVar192 = pfVar31[6] * pfVar38[6] + fVar192;
                      fVar138 = pfVar31[7] + fVar138;
                      pfVar31 = pfVar31 + 8;
                      pfVar38 = pfVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar40);
                } while (uVar36 != uVar41);
              }
              auVar68._0_4_ = fVar92 + fVar63;
              auVar68._4_4_ = fVar190 + fVar90;
              auVar68._8_4_ = fVar192 + fVar91;
              auVar68._12_4_ = fVar138 + fVar193;
              auVar139 = vshufpd_avx(auVar68,auVar68,1);
              auVar69._0_4_ = auVar139._0_4_ + auVar68._0_4_;
              auVar69._4_4_ = auVar139._4_4_ + auVar68._4_4_;
              auVar69._8_4_ = auVar139._8_4_ + auVar68._8_4_;
              auVar69._12_4_ = auVar139._12_4_ + auVar68._12_4_;
              auVar139 = vmovshdup_avx(auVar69);
              fVar49 = auVar139._0_4_ + fVar49 + auVar69._0_4_;
              auVar139 = ZEXT416((uint)fVar49);
              fVar63 = fVar49;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(0));
                fVar63 = auVar139._0_4_;
                break;
              case 2:
                auVar53._0_12_ = ZEXT812(0);
                auVar53._12_4_ = 0;
                auVar139 = vcmpss_avx(auVar53,auVar139,1);
                auVar93._8_4_ = 0x3f800000;
                auVar93._0_8_ = 0x3f8000003f800000;
                auVar93._12_4_ = 0x3f800000;
                auVar139 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar93,auVar139);
                fVar91 = auVar139._0_4_;
LAB_00309c1c:
                fVar63 = fVar91 * fVar49;
                break;
              case 3:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar139 = vminss_avx(auVar139,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar63 = auVar139._0_4_;
                break;
              case 4:
                fVar49 = expf(-fVar49);
                fVar63 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                local_48 = auVar139;
                fVar49 = expf(fVar49);
                fVar49 = logf(fVar49 + 1.0);
                fVar49 = tanhf(fVar49);
                fVar63 = fVar49 * (float)local_48._0_4_;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar193 = -fVar91 / fVar90;
                fVar63 = 0.0;
                if ((fVar193 <= fVar49) && (fVar63 = fVar49, fVar49 <= fVar193 + 1.0 / fVar90)) {
                  fVar91 = fVar90 * fVar49 + fVar91;
                  goto LAB_00309c1c;
                }
              }
              *(float *)((long)pvVar26 + uVar37 * 4 + lVar42) = fVar63;
              uVar37 = uVar37 + 1;
              iVar30 = iVar30 + 8;
            } while (uVar37 != _w);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_50);
      }
      bVar45 = 0 < (int)uVar27;
      bVar47 = iVar29 == 4;
      if (iVar2 == 8 && (bVar47 && bVar45)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_120 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar205._8_4_ = 0x3f000000;
        auVar205._0_8_ = 0x3f0000003f000000;
        auVar205._12_4_ = 0x3f000000;
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_120 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar70 = ZEXT816(0) << 0x40;
              }
              else {
                auVar70 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_120 * 0x10);
              }
              auVar267 = ZEXT1664(auVar70);
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_120 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4 +
                                   4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-7];
                      fVar63 = pfVar31[-6];
                      fVar90 = pfVar31[-5];
                      fVar91 = pfVar31[-4];
                      fVar193 = pfVar31[-3];
                      fVar92 = pfVar31[-2];
                      fVar190 = pfVar31[-1];
                      fVar192 = *pfVar31;
                      auVar267 = ZEXT1664(CONCAT412(fVar49 * pfVar43[3] + auVar267._12_4_ +
                                                    fVar63 * pfVar43[7] + fVar90 * pfVar43[0xb] +
                                                    fVar91 * pfVar43[0xf] + fVar193 * pfVar43[0x13]
                                                    + fVar92 * pfVar43[0x17] +
                                                    fVar190 * pfVar43[0x1b] +
                                                    fVar192 * pfVar43[0x1f],
                                                    CONCAT48(fVar49 * pfVar43[2] + auVar267._8_4_ +
                                                             fVar63 * pfVar43[6] +
                                                             fVar90 * pfVar43[10] +
                                                             fVar91 * pfVar43[0xe] +
                                                             fVar193 * pfVar43[0x12] +
                                                             fVar92 * pfVar43[0x16] +
                                                             fVar190 * pfVar43[0x1a] +
                                                             fVar192 * pfVar43[0x1e],
                                                             CONCAT44(fVar49 * pfVar43[1] +
                                                                      auVar267._4_4_ +
                                                                      fVar63 * pfVar43[5] +
                                                                      fVar90 * pfVar43[9] +
                                                                      fVar91 * pfVar43[0xd] +
                                                                      fVar193 * pfVar43[0x11] +
                                                                      fVar92 * pfVar43[0x15] +
                                                                      fVar190 * pfVar43[0x19] +
                                                                      fVar192 * pfVar43[0x1d],
                                                                      fVar49 * *pfVar43 +
                                                                      auVar267._0_4_ +
                                                                      fVar63 * pfVar43[4] +
                                                                      fVar90 * pfVar43[8] +
                                                                      fVar91 * pfVar43[0xc] +
                                                                      fVar193 * pfVar43[0x10] +
                                                                      fVar92 * pfVar43[0x14] +
                                                                      fVar190 * pfVar43[0x18] +
                                                                      fVar192 * pfVar43[0x1c]))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  auVar70 = auVar267._0_16_;
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar139 = auVar89._0_16_;
              fVar49 = auVar70._4_4_;
              fVar63 = auVar70._8_4_;
              fVar90 = auVar70._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar70 = vmaxps_avx(auVar139,auVar70);
                break;
              case 2:
                auVar211 = vmaxps_avx(auVar139,auVar70);
                auVar139 = vminps_avx(auVar139,auVar70);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar70._0_4_ = fVar49 * auVar139._0_4_ + auVar211._0_4_;
                auVar70._4_4_ = fVar49 * auVar139._4_4_ + auVar211._4_4_;
                auVar70._8_4_ = fVar49 * auVar139._8_4_ + auVar211._8_4_;
                auVar70._12_4_ = fVar49 * auVar139._12_4_ + auVar211._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar219._4_4_ = uVar1;
                auVar219._0_4_ = uVar1;
                auVar219._8_4_ = uVar1;
                auVar219._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar283._4_4_ = uVar1;
                auVar283._0_4_ = uVar1;
                auVar283._8_4_ = uVar1;
                auVar283._12_4_ = uVar1;
                auVar139 = vmaxps_avx(auVar70,auVar219);
                auVar70 = vminps_avx(auVar283,auVar139);
                break;
              case 4:
                auVar71._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
                auVar71._8_4_ = -fVar63;
                auVar71._12_4_ = -fVar90;
                auVar99._8_4_ = 0x42b0c0a5;
                auVar99._0_8_ = 0x42b0c0a542b0c0a5;
                auVar99._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar71,auVar99);
                auVar100._8_4_ = 0xc2b0c0a5;
                auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar100._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar100);
                auVar220._0_4_ = auVar202._0_4_ * 1.442695 + 0.5;
                auVar220._4_4_ = auVar202._4_4_ * 1.442695 + 0.5;
                auVar220._8_4_ = auVar202._8_4_ * 1.442695 + 0.5;
                auVar220._12_4_ = auVar202._12_4_ * 1.442695 + 0.5;
                auVar284._0_4_ = (int)auVar220._0_4_;
                auVar284._4_4_ = (int)auVar220._4_4_;
                auVar284._8_4_ = (int)auVar220._8_4_;
                auVar284._12_4_ = (int)auVar220._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar284);
                auVar139 = vcmpps_avx(auVar220,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar206);
                auVar139 = vsubps_avx(auVar211,auVar139);
                fVar49 = auVar139._0_4_ * -0.6931472 + auVar202._0_4_;
                fVar63 = auVar139._4_4_ * -0.6931472 + auVar202._4_4_;
                fVar90 = auVar139._8_4_ * -0.6931472 + auVar202._8_4_;
                fVar91 = auVar139._12_4_ * -0.6931472 + auVar202._12_4_;
                auVar221._0_4_ = (int)auVar139._0_4_;
                auVar221._4_4_ = (int)auVar139._4_4_;
                auVar221._8_4_ = (int)auVar139._8_4_;
                auVar221._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar221,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar206);
                auVar72._0_4_ =
                     (fVar49 * fVar49 *
                      (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                        0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) + fVar49 + 1.0) *
                     auVar139._0_4_ + 1.0;
                auVar72._4_4_ =
                     (fVar63 * fVar63 *
                      (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) * fVar63 +
                        0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) + fVar63 + 1.0) *
                     auVar139._4_4_ + 1.0;
                auVar72._8_4_ =
                     (fVar90 * fVar90 *
                      (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                        0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) + fVar90 + 1.0) *
                     auVar139._8_4_ + 1.0;
                auVar72._12_4_ =
                     (fVar91 * fVar91 *
                      (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                        0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) + fVar91 + 1.0) *
                     auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar72);
                fVar49 = auVar139._0_4_;
                auVar73._0_4_ = auVar72._0_4_ * fVar49;
                fVar63 = auVar139._4_4_;
                auVar73._4_4_ = auVar72._4_4_ * fVar63;
                fVar90 = auVar139._8_4_;
                auVar73._8_4_ = auVar72._8_4_ * fVar90;
                fVar91 = auVar139._12_4_;
                auVar73._12_4_ = auVar72._12_4_ * fVar91;
                auVar139 = vsubps_avx(auVar206,auVar73);
                auVar70._0_4_ = fVar49 + fVar49 * auVar139._0_4_;
                auVar70._4_4_ = fVar63 + fVar63 * auVar139._4_4_;
                auVar70._8_4_ = fVar90 + fVar90 * auVar139._8_4_;
                auVar70._12_4_ = fVar91 + fVar91 * auVar139._12_4_;
                break;
              case 5:
                auVar194._8_4_ = 0x42b0c0a5;
                auVar194._0_8_ = 0x42b0c0a542b0c0a5;
                auVar194._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar70,auVar194);
                auVar258._8_4_ = 0xc2b0c0a5;
                auVar258._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar258._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar258,auVar139);
                auVar268._0_4_ = auVar202._0_4_ * 1.442695 + 0.5;
                auVar268._4_4_ = auVar202._4_4_ * 1.442695 + 0.5;
                auVar268._8_4_ = auVar202._8_4_ * 1.442695 + 0.5;
                auVar268._12_4_ = auVar202._12_4_ * 1.442695 + 0.5;
                auVar281._0_4_ = (int)auVar268._0_4_;
                auVar281._4_4_ = (int)auVar268._4_4_;
                auVar281._8_4_ = (int)auVar268._8_4_;
                auVar281._12_4_ = (int)auVar268._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar281);
                auVar139 = vcmpps_avx(auVar268,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar206);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar282._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar282._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar282._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar282._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar282);
                fVar91 = auVar211._0_4_;
                fVar193 = auVar211._4_4_;
                fVar92 = auVar211._8_4_;
                fVar190 = auVar211._12_4_;
                auVar215._0_4_ = (int)auVar139._0_4_;
                auVar215._4_4_ = (int)auVar139._4_4_;
                auVar215._8_4_ = (int)auVar139._8_4_;
                auVar215._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar215,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar206);
                auVar216._0_4_ =
                     (fVar91 + 1.0 +
                     fVar91 * fVar91 *
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5)) * auVar139._0_4_ + 1.0;
                auVar216._4_4_ =
                     (fVar193 + 1.0 +
                     fVar193 * fVar193 *
                     (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) * fVar193
                       + 0.041665796) * fVar193 + 0.16666666) * fVar193 + 0.5)) * auVar139._4_4_ +
                     1.0;
                auVar216._8_4_ =
                     (fVar92 + 1.0 +
                     fVar92 * fVar92 *
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar139._8_4_ + 1.0;
                auVar216._12_4_ =
                     (fVar190 + 1.0 +
                     fVar190 * fVar190 *
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + 0.5)) * auVar139._12_4_ +
                     1.0;
                auVar94._8_4_ = 0x800000;
                auVar94._0_8_ = 0x80000000800000;
                auVar94._12_4_ = 0x800000;
                auVar139 = vmaxps_avx(auVar216,auVar94);
                auVar211 = vpsrld_avx(auVar139,0x17);
                auVar144._8_4_ = 0xffffff82;
                auVar144._0_8_ = 0xffffff82ffffff82;
                auVar144._12_4_ = 0xffffff82;
                auVar211 = vpaddd_avx(auVar211,auVar144);
                auVar145._8_4_ = 0x807fffff;
                auVar145._0_8_ = 0x807fffff807fffff;
                auVar145._12_4_ = 0x807fffff;
                auVar139 = vandps_avx(auVar139,auVar145);
                auVar257 = vorps_avx(auVar139,auVar205);
                auVar202 = vcvtdq2ps_avx(auVar211);
                auVar146._8_4_ = 0x3f3504f3;
                auVar146._0_8_ = 0x3f3504f33f3504f3;
                auVar146._12_4_ = 0x3f3504f3;
                auVar211 = vcmpps_avx(auVar257,auVar146,1);
                auVar139 = vandps_avx(auVar211,auVar257);
                fVar91 = auVar257._0_4_ + -1.0 + auVar139._0_4_;
                fVar193 = auVar257._4_4_ + -1.0 + auVar139._4_4_;
                fVar92 = auVar257._8_4_ + -1.0 + auVar139._8_4_;
                fVar190 = auVar257._12_4_ + -1.0 + auVar139._12_4_;
                auVar139 = vandps_avx(auVar211,auVar206);
                auVar211 = vsubps_avx(auVar202,auVar139);
                auVar139 = vcmpps_avx(auVar216,_DAT_00312030,2);
                auVar95._0_4_ =
                     (fVar91 * fVar91 *
                      (((((((((fVar91 * 0.070376836 + -0.1151461) * fVar91 + 0.116769984) * fVar91 +
                            -0.12420141) * fVar91 + 0.14249323) * fVar91 + -0.16668057) * fVar91 +
                         0.20000714) * fVar91 + -0.24999994) * fVar91 + 0.3333333) * fVar91 + -0.5)
                     + auVar211._0_4_ * 0.6931472 + fVar91) * -2.0;
                auVar95._4_4_ =
                     (fVar193 * fVar193 *
                      (((((((((fVar193 * 0.070376836 + -0.1151461) * fVar193 + 0.116769984) *
                             fVar193 + -0.12420141) * fVar193 + 0.14249323) * fVar193 + -0.16668057)
                          * fVar193 + 0.20000714) * fVar193 + -0.24999994) * fVar193 + 0.3333333) *
                       fVar193 + -0.5) + auVar211._4_4_ * 0.6931472 + fVar193) * -2.0;
                auVar95._8_4_ =
                     (fVar92 * fVar92 *
                      (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 + 0.116769984) * fVar92 +
                            -0.12420141) * fVar92 + 0.14249323) * fVar92 + -0.16668057) * fVar92 +
                         0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333) * fVar92 + -0.5)
                     + auVar211._8_4_ * 0.6931472 + fVar92) * -2.0;
                auVar95._12_4_ =
                     (fVar190 * fVar190 *
                      (((((((((fVar190 * 0.070376836 + -0.1151461) * fVar190 + 0.116769984) *
                             fVar190 + -0.12420141) * fVar190 + 0.14249323) * fVar190 + -0.16668057)
                          * fVar190 + 0.20000714) * fVar190 + -0.24999994) * fVar190 + 0.3333333) *
                       fVar190 + -0.5) + auVar211._12_4_ * 0.6931472 + fVar190) * -2.0;
                auVar147._8_4_ = 0x7fffffff;
                auVar147._0_8_ = 0x7fffffff7fffffff;
                auVar147._12_4_ = 0x7fffffff;
                auVar139 = vblendvps_avx(auVar95,auVar147,auVar139);
                auVar148._8_4_ = 0x42b0c0a5;
                auVar148._0_8_ = 0x42b0c0a542b0c0a5;
                auVar148._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar139,auVar148);
                auVar149._8_4_ = 0xc2b0c0a5;
                auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar149._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar149);
                auVar150._0_4_ = auVar202._0_4_ * 1.442695 + 0.5;
                auVar150._4_4_ = auVar202._4_4_ * 1.442695 + 0.5;
                auVar150._8_4_ = auVar202._8_4_ * 1.442695 + 0.5;
                auVar150._12_4_ = auVar202._12_4_ * 1.442695 + 0.5;
                auVar217._0_4_ = (int)auVar150._0_4_;
                auVar217._4_4_ = (int)auVar150._4_4_;
                auVar217._8_4_ = (int)auVar150._8_4_;
                auVar217._12_4_ = (int)auVar150._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar217);
                auVar139 = vcmpps_avx(auVar150,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar206);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar218._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar218._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar218._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar218._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar218);
                fVar91 = auVar211._0_4_;
                fVar193 = auVar211._4_4_;
                fVar92 = auVar211._8_4_;
                fVar190 = auVar211._12_4_;
                auVar89 = ZEXT864(0) << 0x20;
                auVar151._0_4_ = (int)auVar139._0_4_;
                auVar151._4_4_ = (int)auVar139._4_4_;
                auVar151._8_4_ = (int)auVar139._8_4_;
                auVar151._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar151,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar206);
                auVar96._0_4_ =
                     (fVar91 + 1.0 +
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91) *
                     auVar139._0_4_ + 1.0;
                auVar96._4_4_ =
                     (fVar193 + 1.0 +
                     (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) * fVar193
                       + 0.041665796) * fVar193 + 0.16666666) * fVar193 + 0.5) * fVar193 * fVar193)
                     * auVar139._4_4_ + 1.0;
                auVar96._8_4_ =
                     (fVar92 + 1.0 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * fVar92 * fVar92) *
                     auVar139._8_4_ + 1.0;
                auVar96._12_4_ =
                     (fVar190 + 1.0 +
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + 0.5) * fVar190 * fVar190)
                     * auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar96);
                fVar91 = auVar139._0_4_;
                fVar193 = auVar139._4_4_;
                fVar92 = auVar139._8_4_;
                fVar190 = auVar139._12_4_;
                auVar97._0_4_ = auVar96._0_4_ * (fVar91 + fVar91);
                auVar97._4_4_ = auVar96._4_4_ * (fVar193 + fVar193);
                auVar97._8_4_ = auVar96._8_4_ * (fVar92 + fVar92);
                auVar97._12_4_ = auVar96._12_4_ * (fVar190 + fVar190);
                auVar195._8_4_ = 0x40000000;
                auVar195._0_8_ = 0x4000000040000000;
                auVar195._12_4_ = 0x40000000;
                auVar139 = vsubps_avx(auVar195,auVar97);
                auVar98._0_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar139._0_4_;
                auVar98._4_4_ = fVar193 + fVar193 + -1.0 + fVar193 * auVar139._4_4_;
                auVar98._8_4_ = fVar92 + fVar92 + -1.0 + fVar92 * auVar139._8_4_;
                auVar98._12_4_ = fVar190 + fVar190 + -1.0 + fVar190 * auVar139._12_4_;
                goto LAB_0030a2d9;
              case 6:
                fVar91 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar193 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar101._0_4_ = fVar91 * auVar70._0_4_ + fVar193;
                auVar101._4_4_ = fVar91 * fVar49 + fVar193;
                auVar101._8_4_ = fVar91 * fVar63 + fVar193;
                auVar101._12_4_ = fVar91 * fVar90 + fVar193;
                auVar139 = vmaxps_avx(auVar139,auVar101);
                auVar98 = vminps_avx(auVar139,auVar206);
LAB_0030a2d9:
                auVar70._0_4_ = auVar98._0_4_ * auVar70._0_4_;
                auVar70._4_4_ = auVar98._4_4_ * fVar49;
                auVar70._8_4_ = auVar98._8_4_ * fVar63;
                auVar70._12_4_ = auVar98._12_4_ * fVar90;
              }
              *pauVar35 = auVar70;
              pauVar35 = pauVar35 + 1;
              iVar39 = iVar39 + 8;
              bVar48 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar48);
          }
          local_120 = local_120 + 1;
        } while (local_120 != uVar27);
      }
      if (iVar2 == 4 && (bVar47 && bVar45)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_120 = 0;
        auVar89 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar207._8_4_ = 0x3f800000;
        auVar207._0_8_ = 0x3f8000003f800000;
        auVar207._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_120 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar74 = ZEXT816(0) << 0x40;
              }
              else {
                auVar74 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_120 * 0x10);
              }
              auVar267 = ZEXT1664(auVar74);
              if (0 < iVar25) {
                pfVar32 = (float *)((this->weight_data_packed).cstep * local_120 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4
                                     + 4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar43;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-3];
                      fVar63 = pfVar31[-2];
                      fVar90 = pfVar31[-1];
                      fVar91 = *pfVar31;
                      auVar267 = ZEXT1664(CONCAT412(fVar49 * pfVar32[3] + auVar267._12_4_ +
                                                    fVar63 * pfVar32[7] + fVar90 * pfVar32[0xb] +
                                                    fVar91 * pfVar32[0xf],
                                                    CONCAT48(fVar49 * pfVar32[2] + auVar267._8_4_ +
                                                             fVar63 * pfVar32[6] +
                                                             fVar90 * pfVar32[10] +
                                                             fVar91 * pfVar32[0xe],
                                                             CONCAT44(fVar49 * pfVar32[1] +
                                                                      auVar267._4_4_ +
                                                                      fVar63 * pfVar32[5] +
                                                                      fVar90 * pfVar32[9] +
                                                                      fVar91 * pfVar32[0xd],
                                                                      fVar49 * *pfVar32 +
                                                                      auVar267._0_4_ +
                                                                      fVar63 * pfVar32[4] +
                                                                      fVar90 * pfVar32[8] +
                                                                      fVar91 * pfVar32[0xc]))));
                      pfVar32 = pfVar32 + 0x10;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  auVar74 = auVar267._0_16_;
                  uVar37 = uVar37 + 1;
                  pfVar43 = (float *)((long)pfVar43 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar37 != uVar41);
              }
              fVar49 = auVar89._0_4_;
              fVar63 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar193 = auVar74._4_4_;
              fVar92 = auVar74._8_4_;
              fVar190 = auVar74._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar74 = vmaxps_avx(auVar74,_DAT_00312030);
                break;
              case 2:
                auVar139 = vmaxps_avx(auVar74,ZEXT816(0) << 0x40);
                auVar211 = vminps_avx(auVar74,ZEXT816(0) << 0x40);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar74._0_4_ = fVar49 * auVar211._0_4_ + auVar139._0_4_;
                auVar74._4_4_ = fVar49 * auVar211._4_4_ + auVar139._4_4_;
                auVar74._8_4_ = fVar49 * auVar211._8_4_ + auVar139._8_4_;
                auVar74._12_4_ = fVar49 * auVar211._12_4_ + auVar139._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar226._4_4_ = uVar1;
                auVar226._0_4_ = uVar1;
                auVar226._8_4_ = uVar1;
                auVar226._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar287._4_4_ = uVar1;
                auVar287._0_4_ = uVar1;
                auVar287._8_4_ = uVar1;
                auVar287._12_4_ = uVar1;
                auVar139 = vmaxps_avx(auVar74,auVar226);
                auVar74 = vminps_avx(auVar287,auVar139);
                break;
              case 4:
                auVar75._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar75._8_4_ = -fVar92;
                auVar75._12_4_ = -fVar190;
                auVar107._8_4_ = 0x42b0c0a5;
                auVar107._0_8_ = 0x42b0c0a542b0c0a5;
                auVar107._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar75,auVar107);
                auVar108._8_4_ = 0xc2b0c0a5;
                auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar108._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar108);
                auVar227._0_4_ = fVar49 + auVar202._0_4_ * 1.442695;
                auVar227._4_4_ = fVar63 + auVar202._4_4_ * 1.442695;
                auVar227._8_4_ = fVar90 + auVar202._8_4_ * 1.442695;
                auVar227._12_4_ = fVar91 + auVar202._12_4_ * 1.442695;
                auVar288._0_4_ = (int)auVar227._0_4_;
                auVar288._4_4_ = (int)auVar227._4_4_;
                auVar288._8_4_ = (int)auVar227._8_4_;
                auVar288._12_4_ = (int)auVar227._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar288);
                auVar139 = vcmpps_avx(auVar227,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar207);
                auVar139 = vsubps_avx(auVar211,auVar139);
                fVar193 = auVar139._0_4_ * -0.6931472 + auVar202._0_4_;
                fVar92 = auVar139._4_4_ * -0.6931472 + auVar202._4_4_;
                fVar190 = auVar139._8_4_ * -0.6931472 + auVar202._8_4_;
                fVar192 = auVar139._12_4_ * -0.6931472 + auVar202._12_4_;
                auVar228._0_4_ = (int)auVar139._0_4_;
                auVar228._4_4_ = (int)auVar139._4_4_;
                auVar228._8_4_ = (int)auVar139._8_4_;
                auVar228._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar228,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar207);
                auVar76._0_4_ =
                     (fVar193 * fVar193 *
                      (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) *
                         fVar193 + 0.041665796) * fVar193 + 0.16666666) * fVar193 + fVar49) +
                     fVar193 + 1.0) * auVar139._0_4_ + 1.0;
                auVar76._4_4_ =
                     (fVar92 * fVar92 *
                      (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                        0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar63) + fVar92 + 1.0) *
                     auVar139._4_4_ + 1.0;
                auVar76._8_4_ =
                     (fVar190 * fVar190 *
                      (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) *
                         fVar190 + 0.041665796) * fVar190 + 0.16666666) * fVar190 + fVar90) +
                     fVar190 + 1.0) * auVar139._8_4_ + 1.0;
                auVar76._12_4_ =
                     (fVar192 * fVar192 *
                      (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) *
                         fVar192 + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar91) +
                     fVar192 + 1.0) * auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar76);
                fVar49 = auVar139._0_4_;
                auVar77._0_4_ = auVar76._0_4_ * fVar49;
                fVar63 = auVar139._4_4_;
                auVar77._4_4_ = auVar76._4_4_ * fVar63;
                fVar90 = auVar139._8_4_;
                auVar77._8_4_ = auVar76._8_4_ * fVar90;
                fVar91 = auVar139._12_4_;
                auVar77._12_4_ = auVar76._12_4_ * fVar91;
                auVar139 = vsubps_avx(auVar207,auVar77);
                auVar74._0_4_ = fVar49 + fVar49 * auVar139._0_4_;
                auVar74._4_4_ = fVar63 + fVar63 * auVar139._4_4_;
                auVar74._8_4_ = fVar90 + fVar90 * auVar139._8_4_;
                auVar74._12_4_ = fVar91 + fVar91 * auVar139._12_4_;
                break;
              case 5:
                auVar196._8_4_ = 0x42b0c0a5;
                auVar196._0_8_ = 0x42b0c0a542b0c0a5;
                auVar196._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar74,auVar196);
                auVar259._8_4_ = 0xc2b0c0a5;
                auVar259._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar259._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar259,auVar139);
                auVar269._0_4_ = auVar202._0_4_ * 1.442695 + fVar49;
                auVar269._4_4_ = auVar202._4_4_ * 1.442695 + fVar63;
                auVar269._8_4_ = auVar202._8_4_ * 1.442695 + fVar90;
                auVar269._12_4_ = auVar202._12_4_ * 1.442695 + fVar91;
                auVar285._0_4_ = (int)auVar269._0_4_;
                auVar285._4_4_ = (int)auVar269._4_4_;
                auVar285._8_4_ = (int)auVar269._8_4_;
                auVar285._12_4_ = (int)auVar269._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar285);
                auVar139 = vcmpps_avx(auVar269,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar207);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar286._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar286._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar286._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar286._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar286);
                fVar192 = auVar211._0_4_;
                fVar138 = auVar211._4_4_;
                fVar185 = auVar211._8_4_;
                fVar186 = auVar211._12_4_;
                auVar222._0_4_ = (int)auVar139._0_4_;
                auVar222._4_4_ = (int)auVar139._4_4_;
                auVar222._8_4_ = (int)auVar139._8_4_;
                auVar222._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar222,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar207);
                auVar223._0_4_ =
                     (fVar192 + 1.0 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar49)) * auVar139._0_4_
                     + 1.0;
                auVar223._4_4_ =
                     (fVar138 + 1.0 +
                     fVar138 * fVar138 *
                     (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138
                       + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar63)) * auVar139._4_4_
                     + 1.0;
                auVar223._8_4_ =
                     (fVar185 + 1.0 +
                     fVar185 * fVar185 *
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + fVar90)) * auVar139._8_4_
                     + 1.0;
                auVar223._12_4_ =
                     (fVar186 + 1.0 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + fVar91)) * auVar139._12_4_
                     + 1.0;
                auVar102._8_4_ = 0x800000;
                auVar102._0_8_ = 0x80000000800000;
                auVar102._12_4_ = 0x800000;
                auVar139 = vmaxps_avx(auVar223,auVar102);
                auVar211 = vpsrld_avx(auVar139,0x17);
                auVar152._8_4_ = 0xffffff82;
                auVar152._0_8_ = 0xffffff82ffffff82;
                auVar152._12_4_ = 0xffffff82;
                auVar211 = vpaddd_avx(auVar211,auVar152);
                auVar153._8_4_ = 0x807fffff;
                auVar153._0_8_ = 0x807fffff807fffff;
                auVar153._12_4_ = 0x807fffff;
                auVar139 = vandps_avx(auVar139,auVar153);
                auVar257 = vorps_avx(auVar139,auVar89._0_16_);
                auVar202 = vcvtdq2ps_avx(auVar211);
                auVar154._8_4_ = 0x3f3504f3;
                auVar154._0_8_ = 0x3f3504f33f3504f3;
                auVar154._12_4_ = 0x3f3504f3;
                auVar211 = vcmpps_avx(auVar257,auVar154,1);
                auVar139 = vandps_avx(auVar211,auVar257);
                fVar192 = auVar257._0_4_ + -1.0 + auVar139._0_4_;
                fVar138 = auVar257._4_4_ + -1.0 + auVar139._4_4_;
                fVar185 = auVar257._8_4_ + -1.0 + auVar139._8_4_;
                fVar186 = auVar257._12_4_ + -1.0 + auVar139._12_4_;
                auVar139 = vandps_avx(auVar211,auVar207);
                auVar211 = vsubps_avx(auVar202,auVar139);
                auVar139 = vcmpps_avx(auVar223,_DAT_00312030,2);
                auVar103._0_4_ =
                     (fVar192 * fVar192 *
                      (((((((((fVar192 * 0.070376836 + -0.1151461) * fVar192 + 0.116769984) *
                             fVar192 + -0.12420141) * fVar192 + 0.14249323) * fVar192 + -0.16668057)
                          * fVar192 + 0.20000714) * fVar192 + -0.24999994) * fVar192 + 0.3333333) *
                       fVar192 + -0.5) + auVar211._0_4_ * 0.6931472 + fVar192) * -2.0;
                auVar103._4_4_ =
                     (fVar138 * fVar138 *
                      (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                             fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 + -0.16668057)
                          * fVar138 + 0.20000714) * fVar138 + -0.24999994) * fVar138 + 0.3333333) *
                       fVar138 + -0.5) + auVar211._4_4_ * 0.6931472 + fVar138) * -2.0;
                auVar103._8_4_ =
                     (fVar185 * fVar185 *
                      (((((((((fVar185 * 0.070376836 + -0.1151461) * fVar185 + 0.116769984) *
                             fVar185 + -0.12420141) * fVar185 + 0.14249323) * fVar185 + -0.16668057)
                          * fVar185 + 0.20000714) * fVar185 + -0.24999994) * fVar185 + 0.3333333) *
                       fVar185 + -0.5) + auVar211._8_4_ * 0.6931472 + fVar185) * -2.0;
                auVar103._12_4_ =
                     (fVar186 * fVar186 *
                      (((((((((fVar186 * 0.070376836 + -0.1151461) * fVar186 + 0.116769984) *
                             fVar186 + -0.12420141) * fVar186 + 0.14249323) * fVar186 + -0.16668057)
                          * fVar186 + 0.20000714) * fVar186 + -0.24999994) * fVar186 + 0.3333333) *
                       fVar186 + -0.5) + auVar211._12_4_ * 0.6931472 + fVar186) * -2.0;
                auVar155._8_4_ = 0x7fffffff;
                auVar155._0_8_ = 0x7fffffff7fffffff;
                auVar155._12_4_ = 0x7fffffff;
                auVar139 = vblendvps_avx(auVar103,auVar155,auVar139);
                auVar156._8_4_ = 0x42b0c0a5;
                auVar156._0_8_ = 0x42b0c0a542b0c0a5;
                auVar156._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar139,auVar156);
                auVar157._8_4_ = 0xc2b0c0a5;
                auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar157._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar157);
                auVar158._0_4_ = auVar202._0_4_ * 1.442695 + fVar49;
                auVar158._4_4_ = auVar202._4_4_ * 1.442695 + fVar63;
                auVar158._8_4_ = auVar202._8_4_ * 1.442695 + fVar90;
                auVar158._12_4_ = auVar202._12_4_ * 1.442695 + fVar91;
                auVar224._0_4_ = (int)auVar158._0_4_;
                auVar224._4_4_ = (int)auVar158._4_4_;
                auVar224._8_4_ = (int)auVar158._8_4_;
                auVar224._12_4_ = (int)auVar158._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar224);
                auVar139 = vcmpps_avx(auVar158,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar207);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar225._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar225._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar225._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar225._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar225);
                fVar192 = auVar211._0_4_;
                fVar138 = auVar211._4_4_;
                fVar185 = auVar211._8_4_;
                fVar186 = auVar211._12_4_;
                auVar89 = ZEXT1664(auVar89._0_16_);
                auVar159._0_4_ = (int)auVar139._0_4_;
                auVar159._4_4_ = (int)auVar139._4_4_;
                auVar159._8_4_ = (int)auVar139._8_4_;
                auVar159._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar159,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar207);
                auVar104._0_4_ =
                     (fVar192 + 1.0 +
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar49) *
                     fVar192 * fVar192) * auVar139._0_4_ + 1.0;
                auVar104._4_4_ =
                     (fVar138 + 1.0 +
                     (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138
                       + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar63) *
                     fVar138 * fVar138) * auVar139._4_4_ + 1.0;
                auVar104._8_4_ =
                     (fVar185 + 1.0 +
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + fVar90) *
                     fVar185 * fVar185) * auVar139._8_4_ + 1.0;
                auVar104._12_4_ =
                     (fVar186 + 1.0 +
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + fVar91) *
                     fVar186 * fVar186) * auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar104);
                fVar49 = auVar139._0_4_;
                fVar63 = auVar139._4_4_;
                fVar90 = auVar139._8_4_;
                fVar91 = auVar139._12_4_;
                auVar105._0_4_ = auVar104._0_4_ * (fVar49 + fVar49);
                auVar105._4_4_ = auVar104._4_4_ * (fVar63 + fVar63);
                auVar105._8_4_ = auVar104._8_4_ * (fVar90 + fVar90);
                auVar105._12_4_ = auVar104._12_4_ * (fVar91 + fVar91);
                auVar197._8_4_ = 0x40000000;
                auVar197._0_8_ = 0x4000000040000000;
                auVar197._12_4_ = 0x40000000;
                auVar139 = vsubps_avx(auVar197,auVar105);
                auVar106._0_4_ = fVar49 + fVar49 + -1.0 + fVar49 * auVar139._0_4_;
                auVar106._4_4_ = fVar63 + fVar63 + -1.0 + fVar63 * auVar139._4_4_;
                auVar106._8_4_ = fVar90 + fVar90 + -1.0 + fVar90 * auVar139._8_4_;
                auVar106._12_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar139._12_4_;
                goto LAB_0030a8ee;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar109._0_4_ = fVar49 * auVar74._0_4_ + fVar63;
                auVar109._4_4_ = fVar49 * fVar193 + fVar63;
                auVar109._8_4_ = fVar49 * fVar92 + fVar63;
                auVar109._12_4_ = fVar49 * fVar190 + fVar63;
                auVar139 = vmaxps_avx(auVar109,_DAT_00312030);
                auVar106 = vminps_avx(auVar139,auVar207);
LAB_0030a8ee:
                auVar74._0_4_ = auVar106._0_4_ * auVar74._0_4_;
                auVar74._4_4_ = auVar106._4_4_ * fVar193;
                auVar74._8_4_ = auVar106._8_4_ * fVar92;
                auVar74._12_4_ = auVar106._12_4_ * fVar190;
              }
              *pauVar35 = auVar74;
              pauVar35 = pauVar35 + 1;
              iVar39 = iVar39 + 4;
              bVar48 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar48);
          }
          local_120 = local_120 + 1;
        } while (local_120 != uVar27);
      }
      if ((bVar47 && bVar45) && iVar2 == 1) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        auVar89 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar208._8_4_ = 0x3f800000;
        auVar208._0_8_ = 0x3f8000003f800000;
        auVar208._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar78 = ZEXT816(0) << 0x40;
              }
              else {
                auVar78 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar37 * 0x10);
              }
              auVar267 = ZEXT1664(auVar78);
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)(_func_int ***)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = *pfVar31;
                      auVar267 = ZEXT1664(CONCAT412(fVar49 * pfVar43[3] + auVar267._12_4_,
                                                    CONCAT48(fVar49 * pfVar43[2] + auVar267._8_4_,
                                                             CONCAT44(fVar49 * pfVar43[1] +
                                                                      auVar267._4_4_,
                                                                      fVar49 * *pfVar43 +
                                                                      auVar267._0_4_))));
                      pfVar43 = pfVar43 + 4;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar78 = auVar267._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar36 != uVar41);
              }
              fVar49 = auVar89._0_4_;
              fVar63 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar193 = auVar78._4_4_;
              fVar92 = auVar78._8_4_;
              fVar190 = auVar78._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar78 = vmaxps_avx(auVar78,_DAT_00312030);
                break;
              case 2:
                auVar139 = vmaxps_avx(auVar78,ZEXT816(0) << 0x40);
                auVar211 = vminps_avx(auVar78,ZEXT816(0) << 0x40);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar78._0_4_ = fVar49 * auVar211._0_4_ + auVar139._0_4_;
                auVar78._4_4_ = fVar49 * auVar211._4_4_ + auVar139._4_4_;
                auVar78._8_4_ = fVar49 * auVar211._8_4_ + auVar139._8_4_;
                auVar78._12_4_ = fVar49 * auVar211._12_4_ + auVar139._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar233._4_4_ = uVar1;
                auVar233._0_4_ = uVar1;
                auVar233._8_4_ = uVar1;
                auVar233._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar291._4_4_ = uVar1;
                auVar291._0_4_ = uVar1;
                auVar291._8_4_ = uVar1;
                auVar291._12_4_ = uVar1;
                auVar139 = vmaxps_avx(auVar78,auVar233);
                auVar78 = vminps_avx(auVar291,auVar139);
                break;
              case 4:
                auVar79._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                auVar79._8_4_ = -fVar92;
                auVar79._12_4_ = -fVar190;
                auVar115._8_4_ = 0x42b0c0a5;
                auVar115._0_8_ = 0x42b0c0a542b0c0a5;
                auVar115._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar79,auVar115);
                auVar116._8_4_ = 0xc2b0c0a5;
                auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar116._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar116);
                auVar234._0_4_ = fVar49 + auVar202._0_4_ * 1.442695;
                auVar234._4_4_ = fVar63 + auVar202._4_4_ * 1.442695;
                auVar234._8_4_ = fVar90 + auVar202._8_4_ * 1.442695;
                auVar234._12_4_ = fVar91 + auVar202._12_4_ * 1.442695;
                auVar292._0_4_ = (int)auVar234._0_4_;
                auVar292._4_4_ = (int)auVar234._4_4_;
                auVar292._8_4_ = (int)auVar234._8_4_;
                auVar292._12_4_ = (int)auVar234._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar292);
                auVar139 = vcmpps_avx(auVar234,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar208);
                auVar139 = vsubps_avx(auVar211,auVar139);
                fVar193 = auVar139._0_4_ * -0.6931472 + auVar202._0_4_;
                fVar92 = auVar139._4_4_ * -0.6931472 + auVar202._4_4_;
                fVar190 = auVar139._8_4_ * -0.6931472 + auVar202._8_4_;
                fVar192 = auVar139._12_4_ * -0.6931472 + auVar202._12_4_;
                auVar235._0_4_ = (int)auVar139._0_4_;
                auVar235._4_4_ = (int)auVar139._4_4_;
                auVar235._8_4_ = (int)auVar139._8_4_;
                auVar235._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar235,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar208);
                auVar80._0_4_ =
                     (fVar193 * fVar193 *
                      (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) *
                         fVar193 + 0.041665796) * fVar193 + 0.16666666) * fVar193 + fVar49) +
                     fVar193 + 1.0) * auVar139._0_4_ + 1.0;
                auVar80._4_4_ =
                     (fVar92 * fVar92 *
                      (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                        0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar63) + fVar92 + 1.0) *
                     auVar139._4_4_ + 1.0;
                auVar80._8_4_ =
                     (fVar190 * fVar190 *
                      (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) *
                         fVar190 + 0.041665796) * fVar190 + 0.16666666) * fVar190 + fVar90) +
                     fVar190 + 1.0) * auVar139._8_4_ + 1.0;
                auVar80._12_4_ =
                     (fVar192 * fVar192 *
                      (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) *
                         fVar192 + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar91) +
                     fVar192 + 1.0) * auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar80);
                fVar49 = auVar139._0_4_;
                auVar81._0_4_ = auVar80._0_4_ * fVar49;
                fVar63 = auVar139._4_4_;
                auVar81._4_4_ = auVar80._4_4_ * fVar63;
                fVar90 = auVar139._8_4_;
                auVar81._8_4_ = auVar80._8_4_ * fVar90;
                fVar91 = auVar139._12_4_;
                auVar81._12_4_ = auVar80._12_4_ * fVar91;
                auVar139 = vsubps_avx(auVar208,auVar81);
                auVar78._0_4_ = fVar49 + fVar49 * auVar139._0_4_;
                auVar78._4_4_ = fVar63 + fVar63 * auVar139._4_4_;
                auVar78._8_4_ = fVar90 + fVar90 * auVar139._8_4_;
                auVar78._12_4_ = fVar91 + fVar91 * auVar139._12_4_;
                break;
              case 5:
                auVar198._8_4_ = 0x42b0c0a5;
                auVar198._0_8_ = 0x42b0c0a542b0c0a5;
                auVar198._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar78,auVar198);
                auVar260._8_4_ = 0xc2b0c0a5;
                auVar260._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar260._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar260,auVar139);
                auVar270._0_4_ = auVar202._0_4_ * 1.442695 + fVar49;
                auVar270._4_4_ = auVar202._4_4_ * 1.442695 + fVar63;
                auVar270._8_4_ = auVar202._8_4_ * 1.442695 + fVar90;
                auVar270._12_4_ = auVar202._12_4_ * 1.442695 + fVar91;
                auVar289._0_4_ = (int)auVar270._0_4_;
                auVar289._4_4_ = (int)auVar270._4_4_;
                auVar289._8_4_ = (int)auVar270._8_4_;
                auVar289._12_4_ = (int)auVar270._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar289);
                auVar139 = vcmpps_avx(auVar270,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar208);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar290._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar290._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar290._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar290._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar290);
                fVar192 = auVar211._0_4_;
                fVar138 = auVar211._4_4_;
                fVar185 = auVar211._8_4_;
                fVar186 = auVar211._12_4_;
                auVar229._0_4_ = (int)auVar139._0_4_;
                auVar229._4_4_ = (int)auVar139._4_4_;
                auVar229._8_4_ = (int)auVar139._8_4_;
                auVar229._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar229,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar208);
                auVar230._0_4_ =
                     (fVar192 + 1.0 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar49)) * auVar139._0_4_
                     + 1.0;
                auVar230._4_4_ =
                     (fVar138 + 1.0 +
                     fVar138 * fVar138 *
                     (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138
                       + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar63)) * auVar139._4_4_
                     + 1.0;
                auVar230._8_4_ =
                     (fVar185 + 1.0 +
                     fVar185 * fVar185 *
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + fVar90)) * auVar139._8_4_
                     + 1.0;
                auVar230._12_4_ =
                     (fVar186 + 1.0 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + fVar91)) * auVar139._12_4_
                     + 1.0;
                auVar110._8_4_ = 0x800000;
                auVar110._0_8_ = 0x80000000800000;
                auVar110._12_4_ = 0x800000;
                auVar139 = vmaxps_avx(auVar230,auVar110);
                auVar211 = vpsrld_avx(auVar139,0x17);
                auVar160._8_4_ = 0xffffff82;
                auVar160._0_8_ = 0xffffff82ffffff82;
                auVar160._12_4_ = 0xffffff82;
                auVar211 = vpaddd_avx(auVar211,auVar160);
                auVar161._8_4_ = 0x807fffff;
                auVar161._0_8_ = 0x807fffff807fffff;
                auVar161._12_4_ = 0x807fffff;
                auVar139 = vandps_avx(auVar139,auVar161);
                auVar257 = vorps_avx(auVar139,auVar89._0_16_);
                auVar202 = vcvtdq2ps_avx(auVar211);
                auVar162._8_4_ = 0x3f3504f3;
                auVar162._0_8_ = 0x3f3504f33f3504f3;
                auVar162._12_4_ = 0x3f3504f3;
                auVar211 = vcmpps_avx(auVar257,auVar162,1);
                auVar139 = vandps_avx(auVar211,auVar257);
                fVar192 = auVar257._0_4_ + -1.0 + auVar139._0_4_;
                fVar138 = auVar257._4_4_ + -1.0 + auVar139._4_4_;
                fVar185 = auVar257._8_4_ + -1.0 + auVar139._8_4_;
                fVar186 = auVar257._12_4_ + -1.0 + auVar139._12_4_;
                auVar139 = vandps_avx(auVar211,auVar208);
                auVar211 = vsubps_avx(auVar202,auVar139);
                auVar139 = vcmpps_avx(auVar230,_DAT_00312030,2);
                auVar111._0_4_ =
                     (fVar192 * fVar192 *
                      (((((((((fVar192 * 0.070376836 + -0.1151461) * fVar192 + 0.116769984) *
                             fVar192 + -0.12420141) * fVar192 + 0.14249323) * fVar192 + -0.16668057)
                          * fVar192 + 0.20000714) * fVar192 + -0.24999994) * fVar192 + 0.3333333) *
                       fVar192 + -0.5) + auVar211._0_4_ * 0.6931472 + fVar192) * -2.0;
                auVar111._4_4_ =
                     (fVar138 * fVar138 *
                      (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                             fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 + -0.16668057)
                          * fVar138 + 0.20000714) * fVar138 + -0.24999994) * fVar138 + 0.3333333) *
                       fVar138 + -0.5) + auVar211._4_4_ * 0.6931472 + fVar138) * -2.0;
                auVar111._8_4_ =
                     (fVar185 * fVar185 *
                      (((((((((fVar185 * 0.070376836 + -0.1151461) * fVar185 + 0.116769984) *
                             fVar185 + -0.12420141) * fVar185 + 0.14249323) * fVar185 + -0.16668057)
                          * fVar185 + 0.20000714) * fVar185 + -0.24999994) * fVar185 + 0.3333333) *
                       fVar185 + -0.5) + auVar211._8_4_ * 0.6931472 + fVar185) * -2.0;
                auVar111._12_4_ =
                     (fVar186 * fVar186 *
                      (((((((((fVar186 * 0.070376836 + -0.1151461) * fVar186 + 0.116769984) *
                             fVar186 + -0.12420141) * fVar186 + 0.14249323) * fVar186 + -0.16668057)
                          * fVar186 + 0.20000714) * fVar186 + -0.24999994) * fVar186 + 0.3333333) *
                       fVar186 + -0.5) + auVar211._12_4_ * 0.6931472 + fVar186) * -2.0;
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar139 = vblendvps_avx(auVar111,auVar163,auVar139);
                auVar164._8_4_ = 0x42b0c0a5;
                auVar164._0_8_ = 0x42b0c0a542b0c0a5;
                auVar164._12_4_ = 0x42b0c0a5;
                auVar139 = vminps_avx(auVar139,auVar164);
                auVar165._8_4_ = 0xc2b0c0a5;
                auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar165._12_4_ = 0xc2b0c0a5;
                auVar202 = vmaxps_avx(auVar139,auVar165);
                auVar166._0_4_ = auVar202._0_4_ * 1.442695 + fVar49;
                auVar166._4_4_ = auVar202._4_4_ * 1.442695 + fVar63;
                auVar166._8_4_ = auVar202._8_4_ * 1.442695 + fVar90;
                auVar166._12_4_ = auVar202._12_4_ * 1.442695 + fVar91;
                auVar231._0_4_ = (int)auVar166._0_4_;
                auVar231._4_4_ = (int)auVar166._4_4_;
                auVar231._8_4_ = (int)auVar166._8_4_;
                auVar231._12_4_ = (int)auVar166._12_4_;
                auVar211 = vcvtdq2ps_avx(auVar231);
                auVar139 = vcmpps_avx(auVar166,auVar211,1);
                auVar139 = vandps_avx(auVar139,auVar208);
                auVar139 = vsubps_avx(auVar211,auVar139);
                auVar232._0_4_ = auVar139._0_4_ * 0.6931472;
                auVar232._4_4_ = auVar139._4_4_ * 0.6931472;
                auVar232._8_4_ = auVar139._8_4_ * 0.6931472;
                auVar232._12_4_ = auVar139._12_4_ * 0.6931472;
                auVar211 = vsubps_avx(auVar202,auVar232);
                fVar192 = auVar211._0_4_;
                fVar138 = auVar211._4_4_;
                fVar185 = auVar211._8_4_;
                fVar186 = auVar211._12_4_;
                auVar89 = ZEXT1664(auVar89._0_16_);
                auVar167._0_4_ = (int)auVar139._0_4_;
                auVar167._4_4_ = (int)auVar139._4_4_;
                auVar167._8_4_ = (int)auVar139._8_4_;
                auVar167._12_4_ = (int)auVar139._12_4_;
                auVar139 = vpslld_avx(auVar167,0x17);
                auVar139 = vpaddd_avx(auVar139,auVar208);
                auVar112._0_4_ =
                     (fVar192 + 1.0 +
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar49) *
                     fVar192 * fVar192) * auVar139._0_4_ + 1.0;
                auVar112._4_4_ =
                     (fVar138 + 1.0 +
                     (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138
                       + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar63) *
                     fVar138 * fVar138) * auVar139._4_4_ + 1.0;
                auVar112._8_4_ =
                     (fVar185 + 1.0 +
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + fVar90) *
                     fVar185 * fVar185) * auVar139._8_4_ + 1.0;
                auVar112._12_4_ =
                     (fVar186 + 1.0 +
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + fVar91) *
                     fVar186 * fVar186) * auVar139._12_4_ + 1.0;
                auVar139 = vrcpps_avx(auVar112);
                fVar49 = auVar139._0_4_;
                fVar63 = auVar139._4_4_;
                fVar90 = auVar139._8_4_;
                fVar91 = auVar139._12_4_;
                auVar113._0_4_ = auVar112._0_4_ * (fVar49 + fVar49);
                auVar113._4_4_ = auVar112._4_4_ * (fVar63 + fVar63);
                auVar113._8_4_ = auVar112._8_4_ * (fVar90 + fVar90);
                auVar113._12_4_ = auVar112._12_4_ * (fVar91 + fVar91);
                auVar199._8_4_ = 0x40000000;
                auVar199._0_8_ = 0x4000000040000000;
                auVar199._12_4_ = 0x40000000;
                auVar139 = vsubps_avx(auVar199,auVar113);
                auVar114._0_4_ = fVar49 + fVar49 + -1.0 + fVar49 * auVar139._0_4_;
                auVar114._4_4_ = fVar63 + fVar63 + -1.0 + fVar63 * auVar139._4_4_;
                auVar114._8_4_ = fVar90 + fVar90 + -1.0 + fVar90 * auVar139._8_4_;
                auVar114._12_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar139._12_4_;
                goto LAB_0030aec3;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar117._0_4_ = fVar49 * auVar78._0_4_ + fVar63;
                auVar117._4_4_ = fVar49 * fVar193 + fVar63;
                auVar117._8_4_ = fVar49 * fVar92 + fVar63;
                auVar117._12_4_ = fVar49 * fVar190 + fVar63;
                auVar139 = vmaxps_avx(auVar117,_DAT_00312030);
                auVar114 = vminps_avx(auVar139,auVar208);
LAB_0030aec3:
                auVar78._0_4_ = auVar114._0_4_ * auVar78._0_4_;
                auVar78._4_4_ = auVar114._4_4_ * fVar193;
                auVar78._8_4_ = auVar114._8_4_ * fVar92;
                auVar78._12_4_ = auVar114._12_4_ * fVar190;
              }
              *pauVar35 = auVar78;
              pauVar35 = pauVar35 + 1;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      if (iVar2 == 4 && (bVar44 && bVar46)) {
        local_58 = top_blob->data;
        local_60 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_68 = (this->weight_data_packed).data;
        local_70 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_50 = (ulong)uVar27;
        local_110 = 0;
        do {
          pvVar26 = local_58;
          pvVar24 = local_b8.data;
          if (-1 < iVar3) {
            lVar40 = local_60 * local_110;
            pfVar32 = (float *)(local_70 * local_110 + (long)local_68);
            lVar42 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            uVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           local_110 * 4));
              }
              auVar139 = auVar89._0_16_;
              if (0 < iVar25) {
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar24 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                pfVar31 = pfVar32;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar38 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      auVar54._0_4_ = *pfVar31 * *pfVar38;
                      auVar54._4_4_ = pfVar31[1] * pfVar38[1];
                      auVar54._8_4_ = pfVar31[2] * pfVar38[2];
                      auVar54._12_4_ = pfVar31[3] * pfVar38[3];
                      auVar139 = vshufpd_avx(auVar54,auVar54,1);
                      auVar55._0_4_ = auVar139._0_4_ + auVar54._0_4_;
                      auVar55._4_4_ = auVar139._4_4_ + auVar54._4_4_;
                      auVar55._8_4_ = auVar139._8_4_ + auVar54._8_4_;
                      auVar55._12_4_ = auVar139._12_4_ + auVar54._12_4_;
                      auVar139 = vmovshdup_avx(auVar55);
                      auVar89 = ZEXT464((uint)(auVar139._0_4_ + auVar89._0_4_ + auVar55._0_4_));
                      pfVar31 = pfVar31 + 4;
                      pfVar38 = pfVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar139 = auVar89._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar42);
                } while (uVar36 != uVar41);
              }
              fVar63 = auVar139._0_4_;
              fVar49 = fVar63;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(0));
                fVar49 = auVar139._0_4_;
                break;
              case 2:
                auVar139 = vcmpss_avx(ZEXT816(0) << 0x40,auVar139,1);
                auVar118._8_4_ = 0x3f800000;
                auVar118._0_8_ = 0x3f8000003f800000;
                auVar118._12_4_ = 0x3f800000;
                auVar139 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar118,auVar139);
                fVar91 = auVar139._0_4_;
LAB_0030b145:
                fVar49 = fVar91 * fVar63;
                break;
              case 3:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar139 = vminss_avx(auVar139,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar49 = auVar139._0_4_;
                break;
              case 4:
                fVar49 = expf(-fVar63);
                fVar49 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                local_48 = auVar139;
                fVar49 = expf(fVar63);
                fVar49 = logf(fVar49 + 1.0);
                fVar49 = tanhf(fVar49);
                fVar49 = fVar49 * (float)local_48._0_4_;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar193 = -fVar91 / fVar90;
                fVar49 = 0.0;
                if ((fVar193 <= fVar63) && (fVar49 = fVar63, fVar63 <= fVar193 + 1.0 / fVar90)) {
                  fVar91 = fVar90 * fVar63 + fVar91;
                  goto LAB_0030b145;
                }
              }
              *(float *)((long)pvVar26 + uVar37 * 4 + lVar40) = fVar49;
              uVar37 = uVar37 + 1;
              iVar30 = iVar30 + 4;
            } while (uVar37 != _w);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_50);
      }
      if ((bVar44 && bVar46) && iVar2 == 1) {
        local_48._0_8_ = top_blob->data;
        iVar2 = top_blob->w;
        sVar8 = top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        do {
          pvVar24 = local_b8.data;
          if (-1 < iVar3) {
            lVar40 = (long)iVar2 * sVar8 * uVar37 + local_48._0_8_;
            lVar42 = (long)local_b8.w * local_b8.elemsize;
            uVar36 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar37 * 4));
              }
              auVar139 = auVar89._0_16_;
              if (0 < iVar25) {
                iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                pfVar43 = (float *)((long)((int)uVar37 * iVar25 * iVar30) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var4));
                pfVar32 = (float *)((long)(_func_int ***)pvVar24 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar36)
                                   * 4);
                uVar33 = 0;
                do {
                  if (0 < iVar30) {
                    pfVar31 = pfVar32;
                    iVar39 = iVar30;
                    do {
                      auVar89 = ZEXT464((uint)(*pfVar43 * *pfVar31 + auVar89._0_4_));
                      pfVar43 = pfVar43 + 1;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar139 = auVar89._0_16_;
                  uVar33 = uVar33 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar42);
                } while (uVar33 != uVar41);
              }
              fVar63 = auVar139._0_4_;
              fVar49 = fVar63;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(0));
                fVar49 = auVar139._0_4_;
                break;
              case 2:
                auVar139 = vcmpss_avx(ZEXT816(0) << 0x40,auVar139,1);
                auVar119._8_4_ = 0x3f800000;
                auVar119._0_8_ = 0x3f8000003f800000;
                auVar119._12_4_ = 0x3f800000;
                auVar139 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar119,auVar139);
                fVar91 = auVar139._0_4_;
LAB_0030b3c3:
                fVar49 = fVar91 * fVar63;
                break;
              case 3:
                auVar139 = vmaxss_avx(auVar139,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar139 = vminss_avx(auVar139,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar49 = auVar139._0_4_;
                break;
              case 4:
                fVar49 = expf(-fVar63);
                fVar49 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                fVar49 = expf(fVar63);
                fVar49 = logf(fVar49 + 1.0);
                fVar49 = tanhf(fVar49);
                fVar49 = fVar49 * fVar63;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar193 = -fVar91 / fVar90;
                fVar49 = 0.0;
                if ((fVar193 <= fVar63) && (fVar49 = fVar63, fVar63 <= fVar193 + 1.0 / fVar90)) {
                  fVar91 = fVar90 * fVar63 + fVar91;
                  goto LAB_0030b3c3;
                }
              }
              *(float *)(lVar40 + uVar36 * 4) = fVar49;
              uVar36 = uVar36 + 1;
            } while (uVar36 != _w);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      iVar39 = 0;
    }
  }
  piVar23 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}